

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

void test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>
               (int num1,_func_int_char_ptr_ptr_char_ptr *read_f,bool is_ok)

{
  byte *pbVar1;
  byte bVar2;
  mp_type mVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined1 *puVar9;
  char (*pacVar10) [16];
  undefined1 *puVar11;
  long lVar12;
  float fVar13;
  FILE *pFVar14;
  char (*pacVar15) [16];
  code *pcVar16;
  double dVar17;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  char *pcVar18;
  byte *pbVar19;
  char *pcVar20;
  ulong uVar21;
  uint uVar22;
  byte *pbVar23;
  ulong uVar24;
  undefined8 *puVar25;
  char cVar26;
  undefined1 *puVar27;
  ulong uVar28;
  undefined4 uVar29;
  byte *pbVar30;
  uint uVar31;
  uint *puVar32;
  char *pcVar33;
  undefined8 *puVar34;
  short sVar35;
  char *pcVar36;
  byte *pbVar37;
  ulong uVar38;
  char *pcVar39;
  byte *pbVar40;
  char *pcVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  char mp_nums [16] [16];
  char str [256];
  double dStack_1a08;
  undefined1 *puStack_1a00;
  char acStack_19f8 [256];
  undefined1 uStack_18f8;
  undefined8 uStack_18f7;
  undefined1 auStack_18ef [247];
  undefined8 *puStack_17f8;
  byte *pbStack_17f0;
  code *pcStack_17e8;
  double dStack_17d8;
  undefined8 *puStack_17d0;
  char (*pacStack_17c8) [16];
  char acStack_17c0 [256];
  byte bStack_16c0;
  undefined1 auStack_16bf [2];
  undefined1 auStack_16bd [6];
  undefined8 uStack_16b7;
  undefined8 uStack_16af;
  long lStack_15b8;
  ulong uStack_15b0;
  char *pcStack_15a8;
  char *pcStack_15a0;
  char *pcStack_1598;
  code *pcStack_1590;
  char (*pacStack_1588) [16];
  char *pcStack_1580;
  float fStack_1578;
  undefined4 uStack_1574;
  double dStack_1570;
  double dStack_1568;
  char (*pacStack_1560) [16];
  char acStack_1558 [256];
  byte bStack_1458;
  undefined8 uStack_1457;
  char acStack_144f [255];
  long lStack_1350;
  ulong uStack_1348;
  char *pcStack_1340;
  char *pcStack_1338;
  char *pcStack_1330;
  code *pcStack_1328;
  char (*pacStack_1320) [16];
  char *pcStack_1318;
  float fStack_1310;
  undefined4 uStack_130c;
  double dStack_1308;
  double dStack_1300;
  code *pcStack_12f8;
  byte bStack_12f0;
  undefined8 uStack_12ef;
  char acStack_12e7 [247];
  char acStack_11f0 [256];
  undefined1 auStack_10f0 [8];
  undefined8 *puStack_10e8;
  ulong uStack_10e0;
  undefined8 *puStack_10d8;
  long lStack_10d0;
  undefined1 *puStack_10c8;
  code *pcStack_10c0;
  code *pcStack_10b8;
  float fStack_10ac;
  double dStack_10a8;
  double dStack_10a0;
  undefined8 *puStack_1098;
  char (*pacStack_1090) [16];
  byte bStack_1088;
  undefined1 auStack_1087 [2];
  undefined1 auStack_1085 [6];
  undefined8 auStack_107f [30];
  char acStack_f88 [256];
  undefined1 auStack_e88 [8];
  char (*pacStack_e80) [16];
  char *pcStack_e78;
  char *pcStack_e70;
  char *pcStack_e68;
  char *pcStack_e60;
  code *pcStack_e58;
  float fStack_e48;
  undefined4 uStack_e44;
  char *pcStack_e40;
  char *pcStack_e38;
  double dStack_e30;
  double dStack_e28;
  char acStack_e20 [9];
  char acStack_e17 [247];
  char acStack_d20 [256];
  undefined1 auStack_c20 [8];
  ulong uStack_c18;
  ulong uStack_c10;
  char *pcStack_c08;
  char (*pacStack_c00) [16];
  undefined1 *puStack_bf8;
  code *pcStack_bf0;
  uint uStack_bdc;
  ulong uStack_bd8;
  float fStack_bcc;
  double dStack_bc8;
  undefined1 *puStack_bc0;
  byte bStack_bb8;
  undefined8 uStack_bb7;
  undefined1 auStack_baf [247];
  char acStack_ab8 [256];
  undefined1 auStack_9b8 [8];
  byte *pbStack_9b0;
  char *pcStack_9a8;
  byte *pbStack_9a0;
  char (*pacStack_998) [16];
  byte *pbStack_990;
  code *pcStack_988;
  float fStack_980;
  int iStack_97c;
  byte *pbStack_978;
  char (*pacStack_970) [16];
  double dStack_968;
  byte bStack_960;
  undefined8 uStack_95f;
  byte abStack_957 [247];
  char acStack_860 [256];
  undefined1 auStack_760 [8];
  undefined1 *puStack_758;
  char *pcStack_750;
  undefined1 *puStack_748;
  char *pcStack_740;
  long lStack_738;
  code *pcStack_730;
  uint uStack_728;
  float fStack_724;
  char *pcStack_720;
  ulong uStack_718;
  double dStack_710;
  byte bStack_708;
  undefined8 uStack_707;
  undefined1 auStack_6ff [247];
  char acStack_608 [256];
  undefined1 auStack_508 [8];
  byte *pbStack_500;
  byte *pbStack_4f8;
  ulong uStack_4f0;
  byte *pbStack_4e8;
  byte *pbStack_4e0;
  code *pcStack_4d8;
  uint uStack_4c4;
  float fStack_4c0;
  undefined4 uStack_4bc;
  ulong uStack_4b8;
  byte *pbStack_4b0;
  double dStack_4a8;
  byte bStack_4a0;
  undefined8 uStack_49f;
  byte abStack_497 [247];
  char acStack_3a0 [256];
  byte abStack_2a0 [8];
  byte *pbStack_298;
  byte *pbStack_290;
  byte *pbStack_288;
  byte *pbStack_280;
  byte *pbStack_278;
  code *pcStack_270;
  uint local_25c;
  float local_258;
  undefined4 local_254;
  byte *local_250;
  byte *local_248;
  double local_240;
  byte local_238;
  undefined8 local_237;
  byte local_22f [247];
  char local_138 [256];
  byte local_38 [8];
  
  local_254 = SUB84(read_f,0);
  builtin_strncpy(local_138,"typed read of ",0xf);
  pcVar36 = (char *)(long)num1;
  pcVar41 = (char *)(ulong)(uint)num1;
  if (num1 < 0) {
    pcVar18 = "%lld";
    pbVar37 = (byte *)pcVar36;
  }
  else {
    pcVar18 = "%llu";
    pbVar37 = (byte *)pcVar41;
  }
  pcStack_270 = (code *)0x12ef42;
  local_25c = num1;
  iVar4 = snprintf(local_138 + 0xe,0xf2,pcVar18,pbVar37);
  pcVar39 = local_138 + 0xe + iVar4;
  iVar5 = 0;
  pcStack_270 = (code *)0x12ef61;
  iVar4 = snprintf(pcVar39,(size_t)(local_38 + -(long)pcVar39)," into ");
  pcVar18 = (char *)(local_38 + -(long)(pcVar39 + iVar4));
  pcStack_270 = (code *)0x12ef80;
  snprintf(pcVar39 + iVar4,(size_t)pcVar18,"int%zu_t",8);
  pcStack_270 = (code *)0x12ef8f;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x12efa8;
  pFVar14 = _stdout;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x12efb8;
  fputs(local_138,_stdout);
  pcStack_270 = (code *)0x12efc5;
  fputc(10,_stdout);
  if (-1 < (int)local_25c) {
    pcStack_270 = (code *)0x12efd9;
    iVar5 = test_encode_uint_all_sizes((char (*) [16])&local_238,(uint64_t)pcVar41);
  }
  pacVar15 = (char (*) [16])(&local_238 + (long)iVar5 * 0x10);
  pcStack_270 = (code *)0x12effb;
  local_250 = (byte *)pcVar36;
  iVar4 = test_encode_int_all_sizes(pacVar15,(int64_t)pcVar36);
  uVar22 = iVar5 + iVar4;
  if (uVar22 != 0 && SCARRY4(iVar5,iVar4) == (int)uVar22 < 0) {
    local_258 = (float)(int)local_25c;
    local_240 = (double)(int)local_25c;
    pbVar40 = (byte *)(ulong)uVar22;
    pbVar37 = (byte *)((long)&local_237 + 1);
    pbVar23 = (byte *)0x0;
    do {
      uVar22 = (uint)pacVar15;
      lVar7 = (long)pbVar23 * 0x10;
      pbVar30 = &local_238 + lVar7;
      bVar2 = pbVar37[-2];
      pbVar19 = (byte *)(ulong)bVar2;
      mVar3 = mp_type_hint[(long)pbVar19];
      if (mVar3 == MP_UINT) {
        switch(bVar2) {
        case 0xcc:
          pbVar19 = (byte *)(ulong)pbVar37[-1];
          pcVar36 = (char *)pbVar37;
          break;
        case 0xcd:
          pbVar19 = (byte *)(ulong)(ushort)(*(ushort *)(pbVar37 + -1) << 8 |
                                           *(ushort *)(pbVar37 + -1) >> 8);
          pcVar36 = (char *)(local_22f + lVar7 + -6);
          break;
        case 0xce:
          uVar31 = *(uint *)(pbVar37 + -1);
          pbVar19 = (byte *)(ulong)(uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 |
                                    (uVar31 & 0xff00) << 8 | uVar31 << 0x18);
          pcVar36 = (char *)(local_22f + lVar7 + -4);
          break;
        case 0xcf:
          uVar38 = *(ulong *)(pbVar37 + -1);
          pbVar19 = (byte *)(uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                             (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                             (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                             (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
          pcVar36 = (char *)(local_22f + lVar7);
          break;
        default:
          if (-1 < (char)bVar2) {
            pcVar36 = (char *)(local_22f + lVar7 + -8);
            break;
          }
LAB_0012f3c4:
          pcStack_270 = (code *)0x12f3c9;
          test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>();
          goto LAB_0012f3c9;
        }
        if (pbVar19 == local_250) goto LAB_0012f1a1;
LAB_0012f41b:
        uVar29 = SUB84(pcVar36,0);
        pcStack_270 = (code *)0x12f420;
        test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>();
        pcVar36 = (char *)pbVar40;
        goto LAB_0012f420;
      }
      if (mVar3 != MP_FLOAT) {
        if (mVar3 != MP_INT) {
          if (bVar2 != 0xcb) goto LAB_0012f3ce;
          uVar38 = *(ulong *)(pbVar37 + -1);
          dVar17 = (double)(uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                            (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                            (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                            (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
          if ((dVar17 != local_240) || (NAN(dVar17) || NAN(local_240))) {
            pcStack_270 = (code *)0x12f3f2;
            test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>();
            goto LAB_0012f3f2;
          }
          pcVar36 = (char *)(local_22f + lVar7);
          goto LAB_0012f1a1;
        }
        switch(bVar2) {
        case 0xd0:
          pbVar19 = (byte *)(long)(char)pbVar37[-1];
          pcVar36 = (char *)pbVar37;
          break;
        case 0xd1:
          pbVar19 = (byte *)(long)(short)(*(ushort *)(pbVar37 + -1) << 8 |
                                         *(ushort *)(pbVar37 + -1) >> 8);
          pcVar36 = (char *)(local_22f + lVar7 + -6);
          break;
        case 0xd2:
          uVar31 = *(uint *)(pbVar37 + -1);
          pbVar19 = (byte *)(long)(int)(uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 |
                                        (uVar31 & 0xff00) << 8 | uVar31 << 0x18);
          pcVar36 = (char *)(local_22f + lVar7 + -4);
          break;
        case 0xd3:
          uVar38 = *(ulong *)(pbVar37 + -1);
          pbVar19 = (byte *)(uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                             (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                             (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                             (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
          pcVar36 = (char *)(local_22f + lVar7);
          break;
        default:
          if (bVar2 < 0xe0) {
            pcStack_270 = (code *)0x12f3c4;
            test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>();
            goto LAB_0012f3c4;
          }
          pbVar19 = (byte *)(long)(char)bVar2;
          pcVar36 = (char *)(local_22f + lVar7 + -8);
        }
        if (pbVar19 == local_250) goto LAB_0012f1a1;
LAB_0012f416:
        pcStack_270 = (code *)0x12f41b;
        test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>();
        goto LAB_0012f41b;
      }
      if (bVar2 != 0xca) {
LAB_0012f3f2:
        pcStack_270 = (code *)0x12f411;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar31 = *(uint *)(pbVar37 + -1);
      fVar13 = (float)(uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                      uVar31 << 0x18);
      if ((fVar13 != local_258) || (NAN(fVar13) || NAN(local_258))) {
        pcStack_270 = (code *)0x12f416;
        test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>();
        goto LAB_0012f416;
      }
      pcVar36 = (char *)(pbVar37 + 3);
LAB_0012f1a1:
      pcVar18 = (char *)(pbVar37 + -2);
      switch(bVar2) {
      case 0xcc:
        pcVar41 = (char *)(ulong)pbVar37[-1];
        pbVar30 = pbVar37;
        break;
      case 0xcd:
        pcVar41 = (char *)(ulong)(ushort)(*(ushort *)(pbVar37 + -1) << 8 |
                                         *(ushort *)(pbVar37 + -1) >> 8);
        pbVar30 = local_22f + lVar7 + -6;
        break;
      case 0xce:
        uVar22 = *(uint *)(pbVar37 + -1);
        pcVar41 = (char *)(ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8
                                 | uVar22 << 0x18);
        pbVar30 = local_22f + lVar7 + -4;
        break;
      case 0xcf:
        uVar38 = *(ulong *)(pbVar37 + -1);
        pcVar41 = (char *)(uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                           (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                           (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                           (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
        pbVar30 = local_22f + lVar7;
        break;
      case 0xd0:
        pcVar41 = (char *)CONCAT71((int7)((ulong)pcVar41 >> 8),pbVar37[-1]);
        pbVar30 = local_22f + lVar7 + -7;
        goto LAB_0012f245;
      case 0xd1:
        pbVar30 = pbVar37 + 1;
        pcVar41 = (char *)(long)(short)(*(ushort *)(pbVar37 + -1) << 8 |
                                       *(ushort *)(pbVar37 + -1) >> 8);
        goto LAB_0012f238;
      case 0xd2:
        uVar22 = *(uint *)(pbVar37 + -1);
        pbVar30 = local_22f + lVar7 + -4;
        pcVar41 = (char *)(long)(int)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 |
                                      (uVar22 & 0xff00) << 8 | uVar22 << 0x18);
        goto LAB_0012f238;
      case 0xd3:
        uVar38 = *(ulong *)(pbVar37 + -1);
        pcVar41 = (char *)(uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                           (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                           (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                           (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
        pbVar30 = local_22f + lVar7;
LAB_0012f238:
        if ((byte *)(long)(char)pcVar41 == (byte *)pcVar41) goto LAB_0012f245;
        goto LAB_0012f39c;
      default:
        if ((char)bVar2 < -0x20) goto LAB_0012f39c;
        iVar4 = 1;
        iVar5 = 0;
        pcVar41 = (char *)(CONCAT71((int7)((ulong)pFVar14 >> 8),bVar2) & 0xffffffff);
        pbVar30 = local_22f + lVar7 + -8;
        goto LAB_0012f24c;
      }
      if (pcVar41 < (byte *)0x80) {
LAB_0012f245:
        iVar4 = 1;
        iVar5 = 0;
      }
      else {
LAB_0012f39c:
        pcVar41 = (char *)0x0;
        iVar5 = 1;
        iVar4 = 0;
        pbVar30 = (byte *)pcVar18;
      }
LAB_0012f24c:
      if ((char)local_254 == '\0') {
        pcVar41 = 
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
        pcStack_270 = (code *)0x12f30c;
        _ok(iVar5,"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
        pacVar15 = (char (*) [16])(ulong)((byte *)pcVar18 == pbVar30);
        pcVar36 = "mp_num_pos2 == mp_nums[i]";
        pFVar14 = (FILE *)0x738;
        pcStack_270 = (code *)0x12f332;
        _ok((uint)((byte *)pcVar18 == pbVar30),"mp_num_pos2 == mp_nums[i]",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x738,"check position");
      }
      else {
        pcVar18 = 
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
        pcStack_270 = (code *)0x12f28c;
        local_248 = pbVar23;
        _ok(iVar4,"rc == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
        uVar22 = (uint)((byte *)pcVar36 == pbVar30);
        uVar29 = 0x14db41;
        pcStack_270 = (code *)0x12f2b2;
        _ok((uint)((byte *)pcVar36 == pbVar30),"mp_num_pos1 == mp_num_pos2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73c,"check position");
        cVar26 = (char)pcVar41;
        if ((int)local_25c < 0) {
          pbVar23 = pbVar40;
          if (-1 < cVar26) {
LAB_0012f420:
            pcStack_270 = test_read_num<short,int,int(*)(char_const**,short*)>;
            test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>();
            builtin_strncpy(acStack_3a0,"typed read of ",0xf);
            uVar38 = (ulong)(int)uVar22;
            if ((int)uVar22 < 0) {
              pcVar39 = "%lld";
              uVar28 = uVar38;
            }
            else {
              pcVar39 = "%llu";
              uVar28 = (ulong)uVar22;
            }
            pcStack_4d8 = (code *)0x12f4a8;
            uStack_4c4 = uVar22;
            uStack_4bc = uVar29;
            pbStack_298 = pbVar23;
            pbStack_290 = (byte *)pcVar18;
            pbStack_288 = pbVar30;
            pbStack_280 = pbVar37;
            pbStack_278 = (byte *)pcVar36;
            pcStack_270 = (code *)pcVar41;
            iVar4 = snprintf(acStack_3a0 + 0xe,0xf2,pcVar39,uVar28);
            pcVar41 = acStack_3a0 + 0xe + iVar4;
            iVar5 = 0;
            pcStack_4d8 = (code *)0x12f4c7;
            iVar4 = snprintf(pcVar41,(long)abStack_2a0 - (long)pcVar41," into ");
            pcVar36 = (char *)(abStack_2a0 + -(long)(pcVar41 + iVar4));
            pcStack_4d8 = (code *)0x12f4e6;
            snprintf(pcVar41 + iVar4,(size_t)pcVar36,"int%zu_t",0x10);
            pcStack_4d8 = (code *)0x12f4f5;
            _space((FILE *)_stdout);
            pcStack_4d8 = (code *)0x12f50e;
            fwrite("# ",2,1,_stdout);
            pcStack_4d8 = (code *)0x12f51e;
            fputs(acStack_3a0,_stdout);
            pcStack_4d8 = (code *)0x12f52b;
            fputc(10,_stdout);
            if (-1 < (int)uStack_4c4) {
              pcStack_4d8 = (code *)0x12f53f;
              iVar5 = test_encode_uint_all_sizes((char (*) [16])&bStack_4a0,(ulong)uVar22);
            }
            pacVar15 = (char (*) [16])(&bStack_4a0 + (long)iVar5 * 0x10);
            pcStack_4d8 = (code *)0x12f561;
            uStack_4b8 = uVar38;
            iVar4 = test_encode_int_all_sizes(pacVar15,uVar38);
            uVar22 = iVar5 + iVar4;
            if (uVar22 == 0 || SCARRY4(iVar5,iVar4) != (int)uVar22 < 0) {
              return;
            }
            fStack_4c0 = (float)(int)uStack_4c4;
            dStack_4a8 = (double)(int)uStack_4c4;
            pbVar40 = (byte *)(ulong)uVar22;
            pbVar37 = (byte *)((long)&uStack_49f + 1);
            pbVar23 = (byte *)0x0;
            goto LAB_0012f58e;
          }
          uVar22 = (uint)cVar26;
          pcVar36 = "(int64_t)num1 == (int64_t)num2";
          pFVar14 = (FILE *)0x746;
        }
        else {
          if (cVar26 < '\0') {
LAB_0012f3c9:
            pcStack_270 = (code *)0x12f3ce;
            test_read_num<signed_char,int,int(*)(char_const**,signed_char*)>();
LAB_0012f3ce:
            pcStack_270 = (code *)0x12f3ed;
            __assert_fail("c == 0xcb",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x987,"double mp_decode_double(const char **)");
          }
          uVar22 = (uint)pcVar41 & 0xff;
          pcVar36 = "(uint64_t)num1 == (uint64_t)num2";
          pFVar14 = (FILE *)0x743;
        }
        pacVar15 = (char (*) [16])(ulong)(uVar22 == local_25c);
        pcStack_270 = (code *)0x12f36f;
        _ok((uint)(uVar22 == local_25c),pcVar36,
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            (int)pFVar14,"check int number");
        pbVar23 = local_248;
      }
      pbVar23 = pbVar23 + 1;
      pbVar37 = pbVar37 + 0x10;
      pbVar40 = pbVar40 + -1;
    } while (pbVar40 != (byte *)0x0);
  }
  return;
LAB_0012f58e:
  uVar22 = (uint)pacVar15;
  lVar7 = (long)pbVar23 * 0x10;
  pbVar19 = &bStack_4a0 + lVar7;
  bVar2 = pbVar37[-2];
  uVar38 = (ulong)bVar2;
  uVar28 = (ulong)(uint)(int)(char)bVar2;
  mVar3 = mp_type_hint[uVar38];
  pbVar30 = pbVar37;
  if (mVar3 == MP_UINT) {
    uVar31 = 0x139a3c;
    switch(bVar2) {
    case 0xcc:
      uVar38 = (ulong)pbVar37[-1];
      uVar22 = uVar31;
      break;
    case 0xcd:
      uVar38 = (ulong)(ushort)(*(ushort *)(pbVar37 + -1) << 8 | *(ushort *)(pbVar37 + -1) >> 8);
      pbVar30 = abStack_497 + lVar7 + -6;
      uVar22 = uVar31;
      break;
    case 0xce:
      uVar22 = *(uint *)(pbVar37 + -1);
      uVar38 = (ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                      uVar22 << 0x18);
      pbVar30 = abStack_497 + lVar7 + -4;
      uVar22 = uVar31;
      break;
    case 0xcf:
      uVar38 = *(ulong *)(pbVar37 + -1);
      uVar38 = uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
               (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
               (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 | (uVar38 & 0xff00) << 0x28
               | uVar38 << 0x38;
      pbVar30 = abStack_497 + lVar7;
      uVar22 = uVar31;
      break;
    default:
      if (-1 < (char)bVar2) {
        pbVar30 = abStack_497 + lVar7 + -8;
        break;
      }
LAB_0012f938:
      pcStack_4d8 = (code *)0x12f93d;
      test_read_num<short,int,int(*)(char_const**,short*)>();
      goto LAB_0012f93d;
    }
    if (uVar38 == uStack_4b8) goto LAB_0012f717;
LAB_0012f98f:
    pcStack_4d8 = (code *)0x12f994;
    test_read_num<short,int,int(*)(char_const**,short*)>();
    pbVar30 = pbVar40;
    goto LAB_0012f994;
  }
  if (mVar3 != MP_FLOAT) {
    if (mVar3 != MP_INT) {
      if (bVar2 != 0xcb) goto LAB_0012f942;
      uVar38 = *(ulong *)(pbVar37 + -1);
      dVar17 = (double)(uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                        (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                        (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                        (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
      if ((dVar17 != dStack_4a8) || (NAN(dVar17) || NAN(dStack_4a8))) {
        pcStack_4d8 = (code *)0x12f966;
        test_read_num<short,int,int(*)(char_const**,short*)>();
        goto LAB_0012f966;
      }
      pbVar30 = abStack_497 + lVar7;
      goto LAB_0012f717;
    }
    uVar38 = (ulong)(char)bVar2;
    uVar31 = 0x139a4c;
    switch(bVar2) {
    case 0xd0:
      uVar38 = (ulong)(char)pbVar37[-1];
      uVar22 = uVar31;
      break;
    case 0xd1:
      uVar38 = (ulong)(short)(*(ushort *)(pbVar37 + -1) << 8 | *(ushort *)(pbVar37 + -1) >> 8);
      pbVar30 = abStack_497 + lVar7 + -6;
      uVar22 = uVar31;
      break;
    case 0xd2:
      uVar22 = *(uint *)(pbVar37 + -1);
      uVar38 = (ulong)(int)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                           uVar22 << 0x18);
      pbVar30 = abStack_497 + lVar7 + -4;
      uVar22 = uVar31;
      break;
    case 0xd3:
      uVar38 = *(ulong *)(pbVar37 + -1);
      uVar38 = uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
               (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
               (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 | (uVar38 & 0xff00) << 0x28
               | uVar38 << 0x38;
      pbVar30 = abStack_497 + lVar7;
      uVar22 = uVar31;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_4d8 = (code *)0x12f938;
        test_read_num<short,int,int(*)(char_const**,short*)>();
        goto LAB_0012f938;
      }
      pbVar30 = abStack_497 + lVar7 + -8;
    }
    if (uVar38 == uStack_4b8) goto LAB_0012f717;
LAB_0012f98a:
    pcStack_4d8 = (code *)0x12f98f;
    test_read_num<short,int,int(*)(char_const**,short*)>();
    goto LAB_0012f98f;
  }
  if (bVar2 != 0xca) {
LAB_0012f966:
    pcStack_4d8 = (code *)0x12f985;
    __assert_fail("c == 0xca",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0x97e,"float mp_decode_float(const char **)");
  }
  uVar31 = *(uint *)(pbVar37 + -1);
  fVar13 = (float)(uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                  uVar31 << 0x18);
  if ((fVar13 != fStack_4c0) || (NAN(fVar13) || NAN(fStack_4c0))) {
    pcStack_4d8 = (code *)0x12f98a;
    test_read_num<short,int,int(*)(char_const**,short*)>();
    goto LAB_0012f98a;
  }
  pbVar30 = pbVar37 + 3;
LAB_0012f717:
  pcVar36 = (char *)(pbVar37 + -2);
  switch(bVar2) {
  case 0xcc:
    uVar28 = (ulong)pbVar37[-1];
    goto LAB_0012f74a;
  case 0xcd:
    pbVar19 = pbVar37 + 1;
    uVar28 = (ulong)(ushort)(*(ushort *)(pbVar37 + -1) << 8 | *(ushort *)(pbVar37 + -1) >> 8);
    break;
  case 0xce:
    uVar22 = *(uint *)(pbVar37 + -1);
    uVar28 = (ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                    uVar22 << 0x18);
    pbVar19 = abStack_497 + lVar7 + -4;
    break;
  case 0xcf:
    uVar38 = *(ulong *)(pbVar37 + -1);
    uVar28 = uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
             (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
             (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 | (uVar38 & 0xff00) << 0x28 |
             uVar38 << 0x38;
    pbVar19 = abStack_497 + lVar7;
    break;
  case 0xd0:
    uVar28 = (ulong)(uint)(int)(char)pbVar37[-1];
LAB_0012f74a:
    pbVar19 = abStack_497 + lVar7 + -7;
    goto LAB_0012f7cc;
  case 0xd1:
    uVar28 = (ulong)(ushort)(*(ushort *)(pbVar37 + -1) << 8 | *(ushort *)(pbVar37 + -1) >> 8);
    pbVar19 = abStack_497 + lVar7 + -6;
    goto LAB_0012f7cc;
  case 0xd2:
    uVar22 = *(uint *)(pbVar37 + -1);
    pbVar19 = pbVar37 + 3;
    uVar28 = (ulong)(int)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                         uVar22 << 0x18);
    goto LAB_0012f7b3;
  case 0xd3:
    uVar38 = *(ulong *)(pbVar37 + -1);
    uVar28 = uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
             (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
             (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 | (uVar38 & 0xff00) << 0x28 |
             uVar38 << 0x38;
    pbVar19 = abStack_497 + lVar7;
LAB_0012f7b3:
    if ((long)(short)uVar28 != uVar28) goto LAB_0012f90f;
    goto LAB_0012f7cc;
  default:
    if (-0x21 < (char)bVar2) {
      pbVar19 = abStack_497 + lVar7 + -8;
      goto LAB_0012f7cc;
    }
    goto LAB_0012f90f;
  }
  if (uVar28 < 0x8000) {
LAB_0012f7cc:
    iVar4 = 1;
    iVar5 = 0;
  }
  else {
LAB_0012f90f:
    uVar28 = 0;
    iVar5 = 1;
    iVar4 = 0;
    pbVar19 = (byte *)pcVar36;
  }
  if ((char)uStack_4bc == '\0') {
    pcStack_4d8 = (code *)0x12f894;
    _ok(iVar5,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    pacVar15 = (char (*) [16])(ulong)((byte *)pcVar36 == pbVar19);
    pcStack_4d8 = (code *)0x12f8ba;
    _ok((uint)((byte *)pcVar36 == pbVar19),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
  }
  else {
    pcVar36 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_4d8 = (code *)0x12f813;
    pbStack_4b0 = pbVar23;
    _ok(iVar4,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    uVar22 = (uint)(pbVar30 == pbVar19);
    pcStack_4d8 = (code *)0x12f839;
    _ok((uint)(pbVar30 == pbVar19),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    sVar35 = (short)uVar28;
    if ((int)uStack_4c4 < 0) {
      pbVar23 = pbVar40;
      if (-1 < sVar35) {
LAB_0012f994:
        pcStack_4d8 = test_read_num<int,int,int(*)(char_const**,int*)>;
        test_read_num<short,int,int(*)(char_const**,short*)>();
        builtin_strncpy(acStack_608,"typed read of ",0xf);
        pcVar41 = (char *)(long)(int)uVar22;
        pcVar18 = (char *)(ulong)uVar22;
        if ((int)uVar22 < 0) {
          pcVar20 = "%lld";
          pcVar39 = pcVar41;
        }
        else {
          pcVar20 = "%llu";
          pcVar39 = pcVar18;
        }
        pcStack_730 = (code *)0x12fa16;
        uStack_728 = uVar22;
        pbStack_500 = pbVar23;
        pbStack_4f8 = (byte *)pcVar36;
        uStack_4f0 = uVar28;
        pbStack_4e8 = pbVar37;
        pbStack_4e0 = pbVar30;
        pcStack_4d8 = (code *)pbVar19;
        iVar4 = snprintf(acStack_608 + 0xe,0xf2,pcVar20,pcVar39);
        pcVar36 = acStack_608 + 0xe + iVar4;
        iVar5 = 0;
        pcStack_730 = (code *)0x12fa34;
        iVar4 = snprintf(pcVar36,(size_t)(auStack_508 + -(long)pcVar36)," into ");
        pcStack_730 = (code *)0x12fa53;
        snprintf(pcVar36 + iVar4,(size_t)(auStack_508 + -(long)(pcVar36 + iVar4)),"int%zu_t",0x20);
        pcStack_730 = (code *)0x12fa62;
        _space((FILE *)_stdout);
        pcStack_730 = (code *)0x12fa7b;
        fwrite("# ",2,1,_stdout);
        pcStack_730 = (code *)0x12fa8b;
        fputs(acStack_608,_stdout);
        pcStack_730 = (code *)0x12fa98;
        fputc(10,_stdout);
        if (-1 < (int)uStack_728) {
          pcStack_730 = (code *)0x12faab;
          iVar5 = test_encode_uint_all_sizes((char (*) [16])&bStack_708,(uint64_t)pcVar18);
        }
        pacVar15 = (char (*) [16])(&bStack_708 + (long)iVar5 * 0x10);
        pcStack_730 = (code *)0x12facc;
        pcStack_720 = pcVar41;
        iVar4 = test_encode_int_all_sizes(pacVar15,(int64_t)pcVar41);
        uVar22 = iVar5 + iVar4;
        puVar9 = (undefined1 *)(ulong)uVar22;
        if (uVar22 == 0 || SCARRY4(iVar5,iVar4) != (int)uVar22 < 0) {
          return;
        }
        fStack_724 = (float)(int)uStack_728;
        dStack_710 = (double)(int)uStack_728;
        uVar38 = (ulong)uVar22;
        puVar27 = (undefined1 *)((long)&uStack_707 + 1);
        lVar7 = 0;
        goto LAB_0012faf9;
      }
      uVar22 = (uint)sVar35;
      pcVar41 = "(int64_t)num1 == (int64_t)num2";
      iVar4 = 0x746;
    }
    else {
      if (sVar35 < 0) {
LAB_0012f93d:
        pcStack_4d8 = (code *)0x12f942;
        test_read_num<short,int,int(*)(char_const**,short*)>();
LAB_0012f942:
        pcStack_4d8 = (code *)0x12f961;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      uVar22 = (uint)uVar28 & 0xffff;
      pcVar41 = "(uint64_t)num1 == (uint64_t)num2";
      iVar4 = 0x743;
    }
    pacVar15 = (char (*) [16])(ulong)(uVar22 == uStack_4c4);
    pcStack_4d8 = (code *)0x12f8f8;
    _ok((uint)(uVar22 == uStack_4c4),pcVar41,
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        iVar4,"check int number");
    pbVar23 = pbStack_4b0;
  }
  pbVar23 = pbVar23 + 1;
  pbVar37 = pbVar37 + 0x10;
  pbVar40 = pbVar40 + -1;
  if (pbVar40 == (byte *)0x0) {
    return;
  }
  goto LAB_0012f58e;
LAB_0012faf9:
  lVar8 = lVar7 * 0x10;
  bVar2 = puVar27[-2];
  pcVar41 = (char *)(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pcVar41];
  puVar11 = puVar27;
  if (mVar3 != MP_UINT) {
    if (mVar3 == MP_FLOAT) {
      if (bVar2 != 0xca) goto LAB_0012fe3c;
      uVar22 = *(uint *)(puVar27 + -1);
      fVar13 = (float)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                      uVar22 << 0x18);
      if ((fVar13 != fStack_724) || (NAN(fVar13) || NAN(fStack_724))) {
        pcStack_730 = (code *)0x12fe60;
        test_read_num<int,int,int(*)(char_const**,int*)>();
        goto LAB_0012fe60;
      }
      puVar11 = puVar27 + 3;
      goto LAB_0012fc78;
    }
    if (mVar3 == MP_INT) {
      pcVar41 = (char *)(long)(char)bVar2;
      iVar4 = bVar2 - 0xd0;
      puVar32 = &switchD_0012fb52::switchdataD_00139a8c;
      switch(iVar4) {
      case 0:
        pcVar41 = (char *)(long)(char)puVar27[-1];
        break;
      case 1:
        pcVar41 = (char *)(long)(short)(*(ushort *)(puVar27 + -1) << 8 |
                                       *(ushort *)(puVar27 + -1) >> 8);
        puVar11 = auStack_6ff + lVar8 + -6;
        break;
      case 2:
        uVar22 = *(uint *)(puVar27 + -1);
        pcVar41 = (char *)(long)(int)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 |
                                      (uVar22 & 0xff00) << 8 | uVar22 << 0x18);
        puVar11 = auStack_6ff + lVar8 + -4;
        break;
      case 3:
        uVar28 = *(ulong *)(puVar27 + -1);
        pcVar41 = (char *)(uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                           (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                           (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                           (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
        puVar11 = auStack_6ff + lVar8;
        break;
      default:
        if (bVar2 < 0xe0) {
          pcStack_730 = (code *)0x12fe28;
          test_read_num<int,int,int(*)(char_const**,int*)>();
          goto LAB_0012fe28;
        }
        puVar32 = (uint *)pacVar15;
        puVar11 = auStack_6ff + lVar8 + -8;
      }
      if (pcVar41 == pcStack_720) goto LAB_0012fc78;
      pcStack_730 = (code *)0x12fe84;
      test_read_num<int,int,int(*)(char_const**,int*)>();
      goto LAB_0012fe84;
    }
    if (bVar2 != 0xcb) {
LAB_0012fe60:
      pcStack_730 = (code *)0x12fe7f;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    uVar28 = *(ulong *)(puVar27 + -1);
    dVar17 = (double)(uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                      (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                      (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                      (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
    if ((dVar17 == dStack_710) && (!NAN(dVar17) && !NAN(dStack_710))) {
      puVar11 = auStack_6ff + lVar8;
      goto LAB_0012fc78;
    }
    goto LAB_0012fe37;
  }
  iVar4 = bVar2 - 0xcc;
  puVar32 = &switchD_0012fbb0::switchdataD_00139a7c;
  switch(iVar4) {
  case 0:
    pcVar41 = (char *)(ulong)(byte)puVar27[-1];
    break;
  case 1:
    pcVar41 = (char *)(ulong)(ushort)(*(ushort *)(puVar27 + -1) << 8 |
                                     *(ushort *)(puVar27 + -1) >> 8);
    puVar11 = auStack_6ff + lVar8 + -6;
    break;
  case 2:
    uVar22 = *(uint *)(puVar27 + -1);
    pcVar41 = (char *)(ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                             uVar22 << 0x18);
    puVar11 = auStack_6ff + lVar8 + -4;
    break;
  case 3:
    uVar28 = *(ulong *)(puVar27 + -1);
    pcVar41 = (char *)(uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                       (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                       (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                       (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
    puVar11 = auStack_6ff + lVar8;
    break;
  default:
    if (-1 < (char)bVar2) {
      puVar32 = (uint *)pacVar15;
      puVar11 = auStack_6ff + lVar8 + -8;
      break;
    }
LAB_0012fe28:
    pcStack_730 = (code *)0x12fe2d;
    test_read_num<int,int,int(*)(char_const**,int*)>();
    goto LAB_0012fe2d;
  }
  if (pcVar41 != pcStack_720) {
LAB_0012fe84:
    pcStack_730 = test_read_num<int,long,int(*)(char_const**,int*)>;
    test_read_num<int,int,int(*)(char_const**,int*)>();
    builtin_strncpy(acStack_860,"typed read of ",0xf);
    pcVar41 = "%lld";
    if (-1 < (long)puVar32) {
      pcVar41 = "%llu";
    }
    iVar5 = 0;
    pcStack_988 = (code *)0x12fef9;
    iStack_97c = iVar4;
    puStack_758 = puVar9;
    pcStack_750 = pcVar36;
    puStack_748 = puVar11;
    pcStack_740 = pcVar18;
    lStack_738 = lVar7;
    pcStack_730 = (code *)puVar27;
    iVar4 = snprintf(acStack_860 + 0xe,0xf2,pcVar41,puVar32);
    pcVar36 = acStack_860 + (long)iVar4 + 0xe;
    pcStack_988 = (code *)0x12ff1d;
    iVar4 = snprintf(pcVar36,(size_t)(auStack_760 + -(long)pcVar36)," into ");
    pcStack_988 = (code *)0x12ff3c;
    snprintf(pcVar36 + iVar4,(size_t)(auStack_760 + -(long)(pcVar36 + iVar4)),"int%zu_t",0x20);
    pcStack_988 = (code *)0x12ff4b;
    _space((FILE *)_stdout);
    pcStack_988 = (code *)0x12ff64;
    fwrite("# ",2,1,_stdout);
    pcStack_988 = (code *)0x12ff74;
    fputs(acStack_860,_stdout);
    pcStack_988 = (code *)0x12ff81;
    fputc(10,_stdout);
    if (-1 < (long)puVar32) {
      pcStack_988 = (code *)0x12ff93;
      iVar5 = test_encode_uint_all_sizes((char (*) [16])&bStack_960,(uint64_t)puVar32);
    }
    pacVar15 = (char (*) [16])(&bStack_960 + (long)iVar5 * 0x10);
    pcStack_988 = (code *)0x12ffaf;
    iVar4 = test_encode_int_all_sizes(pacVar15,(int64_t)puVar32);
    uVar22 = iVar5 + iVar4;
    if (uVar22 == 0 || SCARRY4(iVar5,iVar4) != (int)uVar22 < 0) {
      return;
    }
    fStack_980 = (float)(long)puVar32;
    dStack_968 = (double)(long)puVar32;
    pbVar40 = (byte *)(ulong)uVar22;
    pbVar37 = (byte *)((long)&uStack_95f + 1);
    pbVar23 = (byte *)0x0;
    pacStack_970 = (char (*) [16])puVar32;
    goto LAB_0012ffde;
  }
LAB_0012fc78:
  uStack_718 = uVar38;
  switch(bVar2) {
  case 0xcc:
    pcVar36 = (char *)(ulong)(byte)puVar27[-1];
    goto LAB_0012fcb0;
  case 0xcd:
    puVar9 = auStack_6ff + lVar8 + -6;
    pcVar36 = (char *)(ulong)(ushort)(*(ushort *)(puVar27 + -1) << 8 |
                                     *(ushort *)(puVar27 + -1) >> 8);
    break;
  case 0xce:
    uVar22 = *(uint *)(puVar27 + -1);
    pcVar36 = (char *)(ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                             uVar22 << 0x18);
    puVar9 = puVar27 + 3;
    goto LAB_0012fcce;
  case 0xcf:
    uVar38 = *(ulong *)(puVar27 + -1);
    pcVar36 = (char *)(uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                       (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                       (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                       (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
    puVar9 = auStack_6ff + lVar8;
LAB_0012fcce:
    if (pcVar36 < (char *)0x80000000) break;
LAB_0012fe07:
    pcVar36 = (char *)0x0;
    iVar4 = 0;
    puVar9 = puVar27 + -2;
    goto LAB_0012fd2c;
  case 0xd0:
    pcVar36 = (char *)(ulong)(uint)(int)(char)puVar27[-1];
LAB_0012fcb0:
    puVar9 = auStack_6ff + lVar8 + -7;
    break;
  case 0xd1:
    puVar9 = auStack_6ff + lVar8 + -6;
    pcVar36 = (char *)(ulong)(uint)(int)(short)(*(ushort *)(puVar27 + -1) << 8 |
                                               *(ushort *)(puVar27 + -1) >> 8);
    break;
  case 0xd2:
    uVar22 = *(uint *)(puVar27 + -1);
    pcVar36 = (char *)(ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                             uVar22 << 0x18);
    puVar9 = auStack_6ff + lVar8 + -4;
    break;
  case 0xd3:
    uVar38 = *(ulong *)(puVar27 + -1);
    uVar28 = uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
             (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8;
    pcVar36 = (char *)(uVar28 | (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                       (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
    if ((char *)(long)(int)uVar28 == pcVar36) {
      puVar9 = auStack_6ff + lVar8;
      break;
    }
    goto LAB_0012fe07;
  default:
    if ((char)bVar2 < -0x20) goto LAB_0012fe07;
    iVar4 = 1;
    pcVar36 = (char *)(ulong)(uint)(int)(char)bVar2;
    puVar9 = auStack_6ff + lVar8 + -8;
    goto LAB_0012fd2c;
  }
  iVar4 = 1;
LAB_0012fd2c:
  pcVar18 = "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  pcStack_730 = (code *)0x12fd50;
  _ok(iVar4,"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X");
  pcStack_730 = (code *)0x12fd76;
  _ok((uint)(puVar11 == puVar9),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  uVar22 = (uint)pcVar36;
  if ((int)uStack_728 < 0) {
    if (-1 < (int)uVar22) goto LAB_0012fe32;
    pcVar41 = "(int64_t)num1 == (int64_t)num2";
    iVar4 = 0x746;
  }
  else {
    if ((int)uVar22 < 0) {
LAB_0012fe2d:
      pcStack_730 = (code *)0x12fe32;
      test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_0012fe32:
      pcStack_730 = (code *)0x12fe37;
      test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_0012fe37:
      pcStack_730 = (code *)0x12fe3c;
      test_read_num<int,int,int(*)(char_const**,int*)>();
LAB_0012fe3c:
      pcStack_730 = (code *)0x12fe5b;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    pcVar41 = "(uint64_t)num1 == (uint64_t)num2";
    iVar4 = 0x743;
  }
  pacVar15 = (char (*) [16])(ulong)(uVar22 == uStack_728);
  pcStack_730 = (code *)0x12fdd8;
  _ok((uint)(uVar22 == uStack_728),pcVar41,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar4,
      "check int number");
  lVar7 = lVar7 + 1;
  puVar27 = puVar27 + 0x10;
  uVar38 = uStack_718 - 1;
  if (uVar38 == 0) {
    return;
  }
  goto LAB_0012faf9;
LAB_0012ffde:
  uVar22 = (uint)pacVar15;
  lVar7 = (long)pbVar23 * 0x10;
  pbVar19 = &bStack_960 + lVar7;
  bVar2 = pbVar37[-2];
  pacVar15 = (char (*) [16])(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pacVar15];
  pbVar30 = pbVar37;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pacVar15 = (char (*) [16])(ulong)pbVar37[-1];
      break;
    case 0xcd:
      pacVar15 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pbVar37 + -1) << 8 | *(ushort *)(pbVar37 + -1) >> 8);
      pbVar30 = abStack_957 + lVar7 + -6;
      break;
    case 0xce:
      uVar31 = *(uint *)(pbVar37 + -1);
      pacVar15 = (char (*) [16])
                 (ulong)(uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                        uVar31 << 0x18);
      pbVar30 = abStack_957 + lVar7 + -4;
      break;
    case 0xcf:
      uVar38 = *(ulong *)(pbVar37 + -1);
      pacVar15 = (char (*) [16])
                 (uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                  (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                  (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                  (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
      pbVar30 = abStack_957 + lVar7;
      break;
    default:
      if (-1 < (char)bVar2) {
        pbVar30 = abStack_957 + lVar7 + -8;
        break;
      }
LAB_00130380:
      pcStack_988 = (code *)0x130385;
      test_read_num<int,long,int(*)(char_const**,int*)>();
      goto LAB_00130385;
    }
    if (pacVar15 == (char (*) [16])puVar32) goto LAB_00130159;
LAB_001303d7:
    pcStack_988 = (code *)0x1303dc;
    test_read_num<int,long,int(*)(char_const**,int*)>();
    pbVar30 = pbVar40;
    pcVar41 = (char *)puVar32;
    goto LAB_001303dc;
  }
  if (mVar3 != MP_FLOAT) {
    if (mVar3 != MP_INT) {
      if (bVar2 != 0xcb) goto LAB_0013038a;
      uVar38 = *(ulong *)(pbVar37 + -1);
      dVar17 = (double)(uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                        (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                        (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                        (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
      if ((dVar17 != dStack_968) || (NAN(dVar17) || NAN(dStack_968))) {
        pcStack_988 = (code *)0x1303ae;
        test_read_num<int,long,int(*)(char_const**,int*)>();
        goto LAB_001303ae;
      }
      pbVar30 = abStack_957 + lVar7;
      goto LAB_00130159;
    }
    pacVar15 = (char (*) [16])(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pacVar15 = (char (*) [16])(long)(char)pbVar37[-1];
      break;
    case 0xd1:
      pacVar15 = (char (*) [16])
                 (long)(short)(*(ushort *)(pbVar37 + -1) << 8 | *(ushort *)(pbVar37 + -1) >> 8);
      pbVar30 = abStack_957 + lVar7 + -6;
      break;
    case 0xd2:
      uVar31 = *(uint *)(pbVar37 + -1);
      pacVar15 = (char (*) [16])
                 (long)(int)(uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                            uVar31 << 0x18);
      pbVar30 = abStack_957 + lVar7 + -4;
      break;
    case 0xd3:
      uVar38 = *(ulong *)(pbVar37 + -1);
      pacVar15 = (char (*) [16])
                 (uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                  (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                  (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                  (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
      pbVar30 = abStack_957 + lVar7;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_988 = (code *)0x130380;
        test_read_num<int,long,int(*)(char_const**,int*)>();
        goto LAB_00130380;
      }
      pbVar30 = abStack_957 + lVar7 + -8;
    }
    if (pacVar15 == (char (*) [16])puVar32) goto LAB_00130159;
LAB_001303d2:
    pcStack_988 = (code *)0x1303d7;
    test_read_num<int,long,int(*)(char_const**,int*)>();
    goto LAB_001303d7;
  }
  if (bVar2 != 0xca) {
LAB_001303ae:
    pcStack_988 = (code *)0x1303cd;
    __assert_fail("c == 0xca",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                  ,0x97e,"float mp_decode_float(const char **)");
  }
  uVar31 = *(uint *)(pbVar37 + -1);
  fVar13 = (float)(uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                  uVar31 << 0x18);
  if ((fVar13 != fStack_980) || (NAN(fVar13) || NAN(fStack_980))) {
    pcStack_988 = (code *)0x1303d2;
    test_read_num<int,long,int(*)(char_const**,int*)>();
    goto LAB_001303d2;
  }
  pbVar30 = pbVar37 + 3;
LAB_00130159:
  pbVar1 = pbVar37 + -2;
  switch(bVar2) {
  case 0xcc:
    pcVar36 = (char *)(ulong)pbVar37[-1];
    goto LAB_0013018c;
  case 0xcd:
    pbVar19 = abStack_957 + lVar7 + -6;
    pcVar36 = (char *)(ulong)(ushort)(*(ushort *)(pbVar37 + -1) << 8 |
                                     *(ushort *)(pbVar37 + -1) >> 8);
    break;
  case 0xce:
    uVar22 = *(uint *)(pbVar37 + -1);
    pcVar36 = (char *)(ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                             uVar22 << 0x18);
    pbVar19 = pbVar37 + 3;
    goto LAB_001301aa;
  case 0xcf:
    uVar38 = *(ulong *)(pbVar37 + -1);
    pcVar36 = (char *)(uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                       (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                       (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                       (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
    pbVar19 = abStack_957 + lVar7;
LAB_001301aa:
    if (pcVar36 < (char *)0x80000000) break;
LAB_00130357:
    iVar5 = 1;
    pcVar36 = (char *)0x0;
    iVar4 = 0;
    pbVar19 = pbVar1;
    goto LAB_00130207;
  case 0xd0:
    pcVar36 = (char *)(ulong)(uint)(int)(char)pbVar37[-1];
LAB_0013018c:
    pbVar19 = abStack_957 + lVar7 + -7;
    break;
  case 0xd1:
    pbVar19 = abStack_957 + lVar7 + -6;
    pcVar36 = (char *)(ulong)(uint)(int)(short)(*(ushort *)(pbVar37 + -1) << 8 |
                                               *(ushort *)(pbVar37 + -1) >> 8);
    break;
  case 0xd2:
    uVar22 = *(uint *)(pbVar37 + -1);
    pcVar36 = (char *)(ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                             uVar22 << 0x18);
    pbVar19 = abStack_957 + lVar7 + -4;
    break;
  case 0xd3:
    uVar38 = *(ulong *)(pbVar37 + -1);
    uVar28 = uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
             (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8;
    pcVar36 = (char *)(uVar28 | (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                       (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
    if ((char *)(long)(int)uVar28 == pcVar36) {
      pbVar19 = abStack_957 + lVar7;
      break;
    }
    goto LAB_00130357;
  default:
    if ((char)bVar2 < -0x20) goto LAB_00130357;
    iVar4 = 1;
    iVar5 = 0;
    pcVar36 = (char *)(ulong)(uint)(int)(char)bVar2;
    pbVar19 = abStack_957 + lVar7 + -8;
    goto LAB_00130207;
  }
  iVar4 = 1;
  iVar5 = 0;
LAB_00130207:
  if ((char)iStack_97c == '\0') {
    pcVar36 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_988 = (code *)0x1302c4;
    _ok(iVar5,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X");
    pacVar15 = (char (*) [16])(ulong)(pbVar1 == pbVar19);
    pcStack_988 = (code *)0x1302ea;
    _ok((uint)(pbVar1 == pbVar19),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
    puVar32 = (uint *)pacStack_970;
  }
  else {
    pcStack_988 = (code *)0x130243;
    pbStack_978 = pbVar23;
    _ok(iVar4,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X");
    uVar22 = (uint)(pbVar30 == pbVar19);
    pcStack_988 = (code *)0x130269;
    _ok((uint)(pbVar30 == pbVar19),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    puVar32 = (uint *)pacStack_970;
    iVar4 = (int)pcVar36;
    if ((long)pacStack_970 < 0) {
      pbVar23 = pbVar40;
      pcVar41 = *pacStack_970;
      if (-1 < iVar4) {
LAB_001303dc:
        pcStack_988 = test_read_num<long,int,int(*)(char_const**,long*)>;
        test_read_num<int,long,int(*)(char_const**,int*)>();
        builtin_strncpy(acStack_ab8,"typed read of ",0xf);
        uStack_bd8 = (ulong)(int)uVar22;
        if ((int)uVar22 < 0) {
          pcVar18 = "%lld";
          uVar38 = uStack_bd8;
        }
        else {
          pcVar18 = "%llu";
          uVar38 = (ulong)uVar22;
        }
        pcStack_bf0 = (code *)0x130463;
        uStack_bdc = uVar22;
        pbStack_9b0 = pbVar23;
        pcStack_9a8 = pcVar36;
        pbStack_9a0 = pbVar30;
        pacStack_998 = (char (*) [16])pcVar41;
        pbStack_990 = pbVar19;
        pcStack_988 = (code *)pbVar37;
        iVar4 = snprintf(acStack_ab8 + 0xe,0xf2,pcVar18,uVar38);
        pcVar36 = acStack_ab8 + 0xe + iVar4;
        iVar5 = 0;
        pcStack_bf0 = (code *)0x130481;
        iVar4 = snprintf(pcVar36,(size_t)(auStack_9b8 + -(long)pcVar36)," into ");
        pcStack_bf0 = (code *)0x1304a0;
        snprintf(pcVar36 + iVar4,(size_t)(auStack_9b8 + -(long)(pcVar36 + iVar4)),"int%zu_t",0x40);
        pcStack_bf0 = (code *)0x1304af;
        _space((FILE *)_stdout);
        pcStack_bf0 = (code *)0x1304c8;
        fwrite("# ",2,1,_stdout);
        pcStack_bf0 = (code *)0x1304d8;
        fputs(acStack_ab8,_stdout);
        pcStack_bf0 = (code *)0x1304e5;
        fputc(10,_stdout);
        if (-1 < (int)uStack_bdc) {
          pcStack_bf0 = (code *)0x1304f9;
          iVar5 = test_encode_uint_all_sizes((char (*) [16])&bStack_bb8,(ulong)uVar22);
        }
        uVar38 = uStack_bd8;
        pcVar36 = (char *)(&bStack_bb8 + (long)iVar5 * 0x10);
        pcStack_bf0 = (code *)0x13051a;
        iVar4 = test_encode_int_all_sizes((char (*) [16])pcVar36,uStack_bd8);
        uVar22 = iVar5 + iVar4;
        if (uVar22 == 0 || SCARRY4(iVar5,iVar4) != (int)uVar22 < 0) {
          return;
        }
        fStack_bcc = (float)(int)uStack_bdc;
        dStack_bc8 = (double)(int)uStack_bdc;
        uVar28 = (ulong)uVar22;
        puVar9 = (undefined1 *)((long)&uStack_bb7 + 1);
        pcVar18 = (char *)0x0;
        goto LAB_00130547;
      }
      pacVar10 = (char (*) [16])(long)iVar4;
      pcVar41 = "(int64_t)num1 == (int64_t)num2";
      iVar4 = 0x746;
    }
    else {
      if (iVar4 < 0) {
LAB_00130385:
        pcStack_988 = (code *)0x13038a;
        test_read_num<int,long,int(*)(char_const**,int*)>();
LAB_0013038a:
        pcStack_988 = (code *)0x1303a9;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pacVar10 = (char (*) [16])((ulong)pcVar36 & 0xffffffff);
      pcVar41 = "(uint64_t)num1 == (uint64_t)num2";
      iVar4 = 0x743;
    }
    pacVar15 = (char (*) [16])(ulong)(pacVar10 == pacStack_970);
    pcStack_988 = (code *)0x13032a;
    _ok((uint)(pacVar10 == pacStack_970),pcVar41,
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        iVar4,"check int number");
    pbVar23 = pbStack_978;
  }
  pbVar23 = pbVar23 + 1;
  pbVar37 = pbVar37 + 0x10;
  pbVar40 = pbVar40 + -1;
  if (pbVar40 == (byte *)0x0) {
    return;
  }
  goto LAB_0012ffde;
LAB_00130547:
  lVar7 = (long)pcVar18 * 0x10;
  bVar2 = puVar9[-2];
  uVar21 = (ulong)bVar2;
  uVar24 = (ulong)(char)bVar2;
  mVar3 = mp_type_hint[uVar21];
  puVar27 = puVar9;
  if (mVar3 != MP_UINT) {
    if (mVar3 == MP_FLOAT) {
      if (bVar2 != 0xca) goto LAB_00130873;
      uVar22 = *(uint *)(puVar9 + -1);
      fVar13 = (float)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                      uVar22 << 0x18);
      if ((fVar13 != fStack_bcc) || (NAN(fVar13) || NAN(fStack_bcc))) {
        pcStack_bf0 = (code *)0x130897;
        test_read_num<long,int,int(*)(char_const**,long*)>();
        goto LAB_00130897;
      }
      puVar27 = puVar9 + 3;
      goto LAB_001306c7;
    }
    if (mVar3 == MP_INT) {
      puVar32 = &switchD_0013059d::switchdataD_00139b0c;
      switch(bVar2) {
      case 0xd0:
        uVar21 = (ulong)(char)puVar9[-1];
        break;
      case 0xd1:
        uVar21 = (ulong)(short)(*(ushort *)(puVar9 + -1) << 8 | *(ushort *)(puVar9 + -1) >> 8);
        puVar27 = auStack_baf + lVar7 + -6;
        break;
      case 0xd2:
        uVar22 = *(uint *)(puVar9 + -1);
        uVar21 = (ulong)(int)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                             uVar22 << 0x18);
        puVar27 = auStack_baf + lVar7 + -4;
        break;
      case 0xd3:
        uVar21 = *(ulong *)(puVar9 + -1);
        uVar21 = uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 |
                 (uVar21 & 0xff0000000000) >> 0x18 | (uVar21 & 0xff00000000) >> 8 |
                 (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18 |
                 (uVar21 & 0xff00) << 0x28 | uVar21 << 0x38;
        puVar27 = auStack_baf + lVar7;
        break;
      default:
        if (bVar2 < 0xe0) {
          pcStack_bf0 = (code *)0x13085f;
          test_read_num<long,int,int(*)(char_const**,long*)>();
          goto LAB_0013085f;
        }
        uVar21 = uVar24;
        puVar27 = auStack_baf + lVar7 + -8;
        puVar32 = (uint *)pcVar36;
      }
      if (uVar21 == uVar38) goto LAB_001306c7;
      pcStack_bf0 = (code *)0x1308bb;
      test_read_num<long,int,int(*)(char_const**,long*)>();
      goto LAB_001308bb;
    }
    if (bVar2 != 0xcb) {
LAB_00130897:
      pcStack_bf0 = (code *)0x1308b6;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    uVar38 = *(ulong *)(puVar9 + -1);
    dVar17 = (double)(uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                      (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                      (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                      (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
    if ((dVar17 == dStack_bc8) && (!NAN(dVar17) && !NAN(dStack_bc8))) {
      puVar27 = auStack_baf + lVar7;
      goto LAB_001306c7;
    }
    goto LAB_0013086e;
  }
  puVar32 = &switchD_001305fc::switchdataD_00139afc;
  switch(bVar2) {
  case 0xcc:
    uVar21 = (ulong)(byte)puVar9[-1];
    break;
  case 0xcd:
    uVar21 = (ulong)(ushort)(*(ushort *)(puVar9 + -1) << 8 | *(ushort *)(puVar9 + -1) >> 8);
    puVar27 = auStack_baf + lVar7 + -6;
    break;
  case 0xce:
    uVar22 = *(uint *)(puVar9 + -1);
    uVar21 = (ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                    uVar22 << 0x18);
    puVar27 = auStack_baf + lVar7 + -4;
    break;
  case 0xcf:
    uVar21 = *(ulong *)(puVar9 + -1);
    uVar21 = uVar21 >> 0x38 | (uVar21 & 0xff000000000000) >> 0x28 |
             (uVar21 & 0xff0000000000) >> 0x18 | (uVar21 & 0xff00000000) >> 8 |
             (uVar21 & 0xff000000) << 8 | (uVar21 & 0xff0000) << 0x18 | (uVar21 & 0xff00) << 0x28 |
             uVar21 << 0x38;
    puVar27 = auStack_baf + lVar7;
    break;
  default:
    if (-1 < (char)bVar2) {
      puVar27 = auStack_baf + lVar7 + -8;
      puVar32 = (uint *)pcVar36;
      break;
    }
LAB_0013085f:
    pcStack_bf0 = (code *)0x130864;
    test_read_num<long,int,int(*)(char_const**,long*)>();
    goto LAB_00130864;
  }
  if (uVar21 != uVar38) {
LAB_001308bb:
    uVar29 = SUB84(puVar27,0);
    pcStack_bf0 = test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>;
    test_read_num<long,int,int(*)(char_const**,long*)>();
    builtin_strncpy(acStack_d20,"typed read of ",0xf);
    pcStack_e58 = (code *)0x130920;
    uStack_e44 = uVar29;
    uStack_c18 = uVar24;
    uStack_c10 = uVar38;
    pcStack_c08 = pcVar18;
    pacStack_c00 = (char (*) [16])pcVar41;
    puStack_bf8 = puVar9;
    pcStack_bf0 = (code *)uVar28;
    iVar4 = snprintf(acStack_d20 + 0xe,0xf2,"%llu",puVar32);
    pcVar36 = acStack_d20 + (long)iVar4 + 0xe;
    pcStack_e58 = (code *)0x130944;
    iVar4 = snprintf(pcVar36,(size_t)(auStack_c20 + -(long)pcVar36)," into ");
    pcStack_e58 = (code *)0x130963;
    snprintf(pcVar36 + iVar4,(size_t)(auStack_c20 + -(long)(pcVar36 + iVar4)),"int%zu_t",0x40);
    pcStack_e58 = (code *)0x130972;
    _space((FILE *)_stdout);
    pcStack_e58 = (code *)0x13098b;
    fwrite("# ",2,1,_stdout);
    pcStack_e58 = (code *)0x13099b;
    fputs(acStack_d20,_stdout);
    pcStack_e58 = (code *)0x1309a8;
    fputc(10,_stdout);
    pcStack_e58 = (code *)0x1309b5;
    pcVar36 = (char *)puVar32;
    uVar22 = test_encode_uint_all_sizes((char (*) [16])acStack_e20,(uint64_t)puVar32);
    if (-1 < (long)puVar32) {
      pcVar36 = (char *)0x7fffffffffffffff;
      pcStack_e58 = (code *)0x1309e0;
      iVar4 = test_encode_int_all_sizes
                        ((char (*) [16])(acStack_e20 + (long)(int)uVar22 * 0x10),0x7fffffffffffffff)
      ;
      uVar22 = uVar22 + iVar4;
    }
    if ((int)uVar22 < 1) {
      return;
    }
    fStack_e48 = (float)puVar32;
    auVar43._8_4_ = (int)((ulong)puVar32 >> 0x20);
    auVar43._0_8_ = puVar32;
    auVar43._12_4_ = 0x45300000;
    dStack_e28 = auVar43._8_8_ - 1.9342813113834067e+25;
    dStack_e30 = dStack_e28 + ((double)CONCAT44(0x43300000,(int)puVar32) - 4503599627370496.0);
    uVar38 = (ulong)uVar22;
    pcVar41 = acStack_e20 + 2;
    pcVar39 = (char *)0x0;
    pcStack_e40 = (char *)puVar32;
    goto LAB_00130a52;
  }
LAB_001306c7:
  puVar11 = puVar9 + -2;
  puStack_bc0 = puVar27;
  switch(bVar2) {
  case 0xcc:
    uVar24 = (ulong)(byte)puVar9[-1];
    goto LAB_00130702;
  case 0xcd:
    puVar11 = auStack_baf + lVar7 + -6;
    uVar24 = (ulong)(ushort)(*(ushort *)(puVar9 + -1) << 8 | *(ushort *)(puVar9 + -1) >> 8);
    break;
  case 0xce:
    uVar22 = *(uint *)(puVar9 + -1);
    uVar24 = (ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                    uVar22 << 0x18);
    puVar11 = auStack_baf + lVar7 + -4;
    break;
  case 0xcf:
    uVar38 = *(ulong *)(puVar9 + -1);
    uVar24 = uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
             (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
             (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 | (uVar38 & 0xff00) << 0x28 |
             uVar38 << 0x38;
    if (-1 < (long)uVar24) goto LAB_0013072c;
LAB_0013083f:
    uVar24 = 0;
    iVar4 = 0;
    goto LAB_0013077a;
  case 0xd0:
    uVar24 = (ulong)(char)puVar9[-1];
LAB_00130702:
    puVar11 = auStack_baf + lVar7 + -7;
    break;
  case 0xd1:
    puVar11 = auStack_baf + lVar7 + -6;
    uVar24 = (ulong)(short)(*(ushort *)(puVar9 + -1) << 8 | *(ushort *)(puVar9 + -1) >> 8);
    break;
  case 0xd2:
    uVar22 = *(uint *)(puVar9 + -1);
    puVar11 = auStack_baf + lVar7 + -4;
    uVar24 = (ulong)(int)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                         uVar22 << 0x18);
    break;
  case 0xd3:
    uVar38 = *(ulong *)(puVar9 + -1);
    uVar24 = uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
             (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
             (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 | (uVar38 & 0xff00) << 0x28 |
             uVar38 << 0x38;
LAB_0013072c:
    puVar11 = auStack_baf + lVar7;
    break;
  default:
    if ((char)bVar2 < -0x20) goto LAB_0013083f;
    puVar11 = auStack_baf + lVar7 + -8;
  }
  iVar4 = 1;
LAB_0013077a:
  pcVar41 = "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
  pcStack_bf0 = (code *)0x13079e;
  _ok(iVar4,"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
  pcStack_bf0 = (code *)0x1307c6;
  _ok((uint)(puStack_bc0 == puVar11),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  uVar38 = uStack_bd8;
  if ((int)uStack_bdc < 0) {
    if (-1 < (long)uVar24) goto LAB_00130869;
    pcVar39 = "(int64_t)num1 == (int64_t)num2";
    iVar4 = 0x746;
  }
  else {
    if ((long)uVar24 < 0) {
LAB_00130864:
      pcStack_bf0 = (code *)0x130869;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_00130869:
      pcStack_bf0 = (code *)0x13086e;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_0013086e:
      pcStack_bf0 = (code *)0x130873;
      test_read_num<long,int,int(*)(char_const**,long*)>();
LAB_00130873:
      pcStack_bf0 = (code *)0x130892;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    pcVar39 = "(uint64_t)num1 == (uint64_t)num2";
    iVar4 = 0x743;
  }
  pcVar36 = (char *)(ulong)(uVar24 == uStack_bd8);
  pcStack_bf0 = (code *)0x13082d;
  _ok((uint)(uVar24 == uStack_bd8),pcVar39,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar4,
      "check int number");
  pcVar18 = pcVar18 + 1;
  puVar9 = puVar9 + 0x10;
  uVar28 = uVar28 - 1;
  if (uVar28 == 0) {
    return;
  }
  goto LAB_00130547;
LAB_00130a52:
  lVar7 = (long)pcVar39 * 0x10;
  bVar2 = pcVar41[-2];
  pcVar20 = (char *)(ulong)bVar2;
  pcVar33 = (char *)(long)(char)bVar2;
  mVar3 = mp_type_hint[(long)pcVar20];
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pcVar20 = (char *)(ulong)(byte)pcVar41[-1];
      pcVar36 = pcVar41;
      break;
    case 0xcd:
      pcVar20 = (char *)(ulong)(ushort)(*(ushort *)(pcVar41 + -1) << 8 |
                                       *(ushort *)(pcVar41 + -1) >> 8);
      pcVar36 = acStack_e20 + lVar7 + 3;
      break;
    case 0xce:
      uVar22 = *(uint *)(pcVar41 + -1);
      pcVar20 = (char *)(ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                               uVar22 << 0x18);
      pcVar36 = acStack_e17 + lVar7 + -4;
      break;
    case 0xcf:
      uVar28 = *(ulong *)(pcVar41 + -1);
      pcVar20 = (char *)(uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                         (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                         (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                         (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
      pcVar36 = acStack_e17 + lVar7;
      break;
    default:
      if (-1 < (char)bVar2) {
        pcVar36 = acStack_e20 + lVar7 + 1;
        break;
      }
LAB_00130db7:
      pcStack_e58 = (code *)0x130dbc;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_00130dbc;
    }
    if ((uint *)pcVar20 != puVar32) {
LAB_00130e0e:
      pcStack_e58 = test_read_num<double,int,int(*)(char_const**,double*)>;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      pcStack_e68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      iVar4 = (int)puVar32;
      builtin_strncpy(acStack_f88,"typed read of ",0xf);
      pcStack_10b8 = (code *)(long)iVar4;
      if (iVar4 < 0) {
        pcVar20 = "%lld";
        pcVar16 = pcStack_10b8;
      }
      else {
        pcVar20 = "%llu";
        pcVar16 = (code *)((ulong)puVar32 & 0xffffffff);
      }
      pcStack_10c0 = (code *)0x130e95;
      pacStack_1090 = (char (*) [16])pcVar36;
      pacStack_e80 = (char (*) [16])pcVar39;
      pcStack_e78 = pcVar41;
      pcStack_e70 = pcVar18;
      pcStack_e60 = acStack_e20 + lVar7;
      pcStack_e58 = (code *)uVar38;
      iVar5 = snprintf(acStack_f88 + 0xe,0xf2,pcVar20,pcVar16);
      pcVar36 = acStack_f88 + 0xe + iVar5;
      iVar6 = 0;
      pcStack_10c0 = (code *)0x130eb4;
      iVar5 = snprintf(pcVar36,(size_t)(auStack_e88 + -(long)pcVar36)," into ");
      puVar9 = auStack_e88 + -(long)(pcVar36 + iVar5);
      pcStack_10c0 = (code *)0x130ece;
      snprintf(pcVar36 + iVar5,(size_t)puVar9,"double");
      pcStack_10c0 = (code *)0x130edd;
      _space((FILE *)_stdout);
      pcStack_10c0 = (code *)0x130ef6;
      fwrite("# ",2,1,_stdout);
      pcStack_10c0 = (code *)0x130f06;
      fputs(acStack_f88,_stdout);
      pcStack_10c0 = (code *)0x130f13;
      fputc(10,_stdout);
      if (-1 < iVar4) {
        pcStack_10c0 = (code *)0x130f24;
        iVar6 = test_encode_uint_all_sizes
                          ((char (*) [16])&bStack_1088,(uint64_t)((ulong)puVar32 & 0xffffffff));
      }
      pcVar41 = (char *)(&bStack_1088 + (long)iVar6 * 0x10);
      pcStack_10c0 = (code *)0x130f42;
      pcVar36 = (char *)pcStack_10b8;
      iVar5 = test_encode_int_all_sizes((char (*) [16])pcVar41,(int64_t)pcStack_10b8);
      uVar22 = iVar6 + iVar5;
      if (uVar22 == 0 || SCARRY4(iVar6,iVar5) != (int)uVar22 < 0) {
        return;
      }
      fStack_10ac = (float)iVar4;
      dStack_10a8 = (double)iVar4;
      uVar38 = (ulong)uVar22;
      puVar34 = (undefined8 *)(auStack_1087 + 1);
      pcVar18 = 
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
      lVar7 = 0;
      goto LAB_00130f73;
    }
  }
  else {
    if (mVar3 == MP_FLOAT) {
      if (bVar2 != 0xca) {
LAB_00130de5:
        pcStack_e58 = (code *)0x130e04;
        __assert_fail("c == 0xca",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x97e,"float mp_decode_float(const char **)");
      }
      uVar22 = *(uint *)(pcVar41 + -1);
      fVar13 = (float)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                      uVar22 << 0x18);
      if ((fVar13 == fStack_e48) && (!NAN(fVar13) && !NAN(fStack_e48))) {
        pcVar36 = pcVar41 + 3;
        goto LAB_00130bdc;
      }
      pcStack_e58 = (code *)0x130e09;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00130e09:
      pcStack_e58 = (code *)0x130e0e;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
      goto LAB_00130e0e;
    }
    if (mVar3 == MP_INT) {
      switch(bVar2) {
      case 0xd0:
        pcVar20 = (char *)(long)pcVar41[-1];
        pcVar36 = pcVar41;
        break;
      case 0xd1:
        pcVar20 = (char *)(long)(short)(*(ushort *)(pcVar41 + -1) << 8 |
                                       *(ushort *)(pcVar41 + -1) >> 8);
        pcVar36 = acStack_e20 + lVar7 + 3;
        break;
      case 0xd2:
        uVar22 = *(uint *)(pcVar41 + -1);
        pcVar20 = (char *)(long)(int)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 |
                                      (uVar22 & 0xff00) << 8 | uVar22 << 0x18);
        pcVar36 = acStack_e17 + lVar7 + -4;
        break;
      case 0xd3:
        uVar28 = *(ulong *)(pcVar41 + -1);
        pcVar20 = (char *)(uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                           (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                           (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                           (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
        pcVar36 = acStack_e17 + lVar7;
        break;
      default:
        if (bVar2 < 0xe0) {
          pcStack_e58 = (code *)0x130db7;
          test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
          goto LAB_00130db7;
        }
        pcVar20 = pcVar33;
        pcVar36 = acStack_e20 + lVar7 + 1;
      }
      if ((uint *)pcVar20 != puVar32) goto LAB_00130e09;
    }
    else {
      if (bVar2 != 0xcb) goto LAB_00130dc1;
      uVar28 = *(ulong *)(pcVar41 + -1);
      dVar17 = (double)(uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                        (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                        (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                        (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
      if ((dVar17 != dStack_e30) || (NAN(dVar17) || NAN(dStack_e30))) {
        pcStack_e58 = (code *)0x130de5;
        test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
        goto LAB_00130de5;
      }
      pcVar36 = acStack_e17 + lVar7;
    }
  }
LAB_00130bdc:
  pcVar18 = pcVar41 + -2;
  switch(bVar2) {
  case 0xcc:
    pcVar33 = (char *)(ulong)(byte)pcVar41[-1];
    goto LAB_00130c11;
  case 0xcd:
    pcVar20 = acStack_e20 + lVar7 + 3;
    pcVar33 = (char *)(ulong)(ushort)(*(ushort *)(pcVar41 + -1) << 8 |
                                     *(ushort *)(pcVar41 + -1) >> 8);
    break;
  case 0xce:
    uVar22 = *(uint *)(pcVar41 + -1);
    pcVar33 = (char *)(ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                             uVar22 << 0x18);
    pcVar20 = acStack_e17 + lVar7 + -4;
    break;
  case 0xcf:
    uVar28 = *(ulong *)(pcVar41 + -1);
    pcVar33 = (char *)(uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                       (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                       (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                       (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
    if (-1 < (long)pcVar33) goto LAB_00130c3f;
LAB_00130d8e:
    pcVar33 = (char *)0x0;
    iVar5 = 1;
    iVar4 = 0;
    pcVar20 = pcVar18;
    goto LAB_00130c91;
  case 0xd0:
    pcVar33 = (char *)(long)pcVar41[-1];
LAB_00130c11:
    pcVar20 = acStack_e20 + lVar7 + 2;
    break;
  case 0xd1:
    pcVar20 = acStack_e20 + lVar7 + 3;
    pcVar33 = (char *)(long)(short)(*(ushort *)(pcVar41 + -1) << 8 | *(ushort *)(pcVar41 + -1) >> 8)
    ;
    break;
  case 0xd2:
    uVar22 = *(uint *)(pcVar41 + -1);
    pcVar20 = acStack_e17 + lVar7 + -4;
    pcVar33 = (char *)(long)(int)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8
                                 | uVar22 << 0x18);
    break;
  case 0xd3:
    uVar28 = *(ulong *)(pcVar41 + -1);
    pcVar33 = (char *)(uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                       (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                       (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                       (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
LAB_00130c3f:
    pcVar20 = acStack_e17 + lVar7;
    break;
  default:
    if ((char)bVar2 < -0x20) goto LAB_00130d8e;
    pcVar20 = acStack_e20 + lVar7 + 1;
  }
  iVar4 = 1;
  iVar5 = 0;
LAB_00130c91:
  if ((char)uStack_e44 == '\0') {
    pcStack_e58 = (code *)0x130d51;
    _ok(iVar5,"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    pcVar36 = "mp_num_pos2 == mp_nums[i]";
    pcStack_e58 = (code *)0x130d77;
    _ok((uint)(pcVar18 == pcVar20),"mp_num_pos2 == mp_nums[i]",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x738,"check position");
    puVar32 = (uint *)pcStack_e40;
  }
  else {
    pcStack_e58 = (code *)0x130ccd;
    pcStack_e38 = pcVar41;
    _ok(iVar4,"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar2);
    pcStack_e58 = (code *)0x130cf3;
    _ok((uint)(pcVar36 == pcVar20),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    puVar32 = (uint *)pcStack_e40;
    if ((long)pcVar33 < 0) {
LAB_00130dbc:
      pcStack_e58 = (code *)0x130dc1;
      test_read_num<long,unsigned_long_long,int(*)(char_const**,long*)>();
LAB_00130dc1:
      pcStack_e58 = (code *)0x130de0;
      __assert_fail("c == 0xcb",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x987,"double mp_decode_double(const char **)");
    }
    pcVar36 = "(uint64_t)num1 == (uint64_t)num2";
    pcStack_e58 = (code *)0x130d27;
    _ok((uint)(pcVar33 == pcStack_e40),"(uint64_t)num1 == (uint64_t)num2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x743,"check int number");
    pcVar41 = pcStack_e38;
    pcVar18 = pcVar39;
  }
  pcVar39 = pcVar39 + 1;
  pcVar41 = pcVar41 + 0x10;
  uVar38 = uVar38 - 1;
  if (uVar38 == 0) {
    return;
  }
  goto LAB_00130a52;
LAB_00130f73:
  lVar8 = lVar7 * 0x10;
  bVar2 = *(byte *)((long)puVar34 + -2);
  pcVar16 = (code *)(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pcVar16];
  puVar25 = puVar34;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pcVar16 = (code *)(ulong)*(byte *)((long)puVar34 + -1);
      break;
    case 0xcd:
      pcVar16 = (code *)(ulong)(ushort)(*(ushort *)((long)puVar34 + -1) << 8 |
                                       *(ushort *)((long)puVar34 + -1) >> 8);
      puVar25 = (undefined8 *)((long)auStack_107f + lVar8 + -6);
      break;
    case 0xce:
      uVar22 = *(uint *)((long)puVar34 + -1);
      pcVar16 = (code *)(ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                               uVar22 << 0x18);
      puVar25 = (undefined8 *)((long)auStack_107f + lVar8 + -4);
      break;
    case 0xcf:
      uVar28 = *(ulong *)((long)puVar34 + -1);
      pcVar16 = (code *)(uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                         (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                         (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                         (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
      puVar25 = auStack_107f + lVar7 * 2;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_001311cd:
        pcStack_10c0 = (code *)0x1311d2;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001311d2:
        pcStack_10c0 = (code *)0x1311d7;
        test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001311d7:
        pcStack_10c0 = (code *)0x1311f6;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar25 = auStack_107f + lVar7 * 2 + -1;
    }
    if (pcVar16 != pcStack_10b8) {
      pcStack_10c0 = (code *)0x13121f;
      test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_0013121f:
      pcStack_10c0 = test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      pcStack_10c0 = (code *)0x139f88;
      builtin_strncpy(acStack_11f0,"typed read of ",0xf);
      pcStack_1328 = (code *)0x13128b;
      uStack_130c = extraout_EDX;
      pcStack_12f8 = (code *)pcVar36;
      puStack_10e8 = puVar25;
      uStack_10e0 = uVar38;
      puStack_10d8 = puVar34;
      lStack_10d0 = lVar7;
      puStack_10c8 = puVar9;
      iVar4 = snprintf(acStack_11f0 + 0xe,0xf2,"%llu",pcVar41);
      pcVar36 = acStack_11f0 + (long)iVar4 + 0xe;
      pcStack_1328 = (code *)0x1312af;
      iVar4 = snprintf(pcVar36,(size_t)(auStack_10f0 + -(long)pcVar36)," into ");
      pcStack_1328 = (code *)0x1312c9;
      snprintf(pcVar36 + iVar4,(size_t)(auStack_10f0 + -(long)(pcVar36 + iVar4)),"double");
      pcStack_1328 = (code *)0x1312d8;
      _space((FILE *)_stdout);
      pcStack_1328 = (code *)0x1312f1;
      fwrite("# ",2,1,_stdout);
      pcStack_1328 = (code *)0x131301;
      fputs(acStack_11f0,_stdout);
      pcStack_1328 = (code *)0x13130e;
      fputc(10,_stdout);
      pcStack_1328 = (code *)0x13131b;
      iVar4 = test_encode_uint_all_sizes((char (*) [16])&bStack_12f0,(uint64_t)pcVar41);
      pacVar15 = (char (*) [16])(&bStack_12f0 + (long)iVar4 * 0x10);
      pcStack_1328 = (code *)0x131339;
      pacStack_1320 = (char (*) [16])pcVar41;
      iVar5 = test_encode_int_all_sizes(pacVar15,(int64_t)pcVar41);
      uVar22 = iVar4 + iVar5;
      if (uVar22 == 0 || SCARRY4(iVar4,iVar5) != (int)uVar22 < 0) {
        return;
      }
      fStack_1310 = (float)(long)pacStack_1320;
      dStack_1308 = (double)(long)pacStack_1320;
      uVar38 = (ulong)uVar22;
      pcVar39 = (char *)((long)&uStack_12ef + 1);
      lVar7 = 0;
      goto LAB_00131368;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_001311fb:
      pcStack_10c0 = (code *)0x13121a;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar22 = *(uint *)((long)puVar34 + -1);
    fVar13 = (float)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                    uVar22 << 0x18);
    if ((fVar13 != fStack_10ac) || (NAN(fVar13) || NAN(fStack_10ac))) goto LAB_001311d2;
    puVar25 = (undefined8 *)((long)puVar34 + 3);
  }
  else if (mVar3 == MP_INT) {
    pcVar16 = (code *)(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pcVar16 = (code *)(long)*(char *)((long)puVar34 + -1);
      pcVar36 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd1:
      pcVar16 = (code *)(long)(short)(*(ushort *)((long)puVar34 + -1) << 8 |
                                     *(ushort *)((long)puVar34 + -1) >> 8);
      puVar25 = (undefined8 *)((long)auStack_107f + lVar8 + -6);
      pcVar36 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd2:
      uVar22 = *(uint *)((long)puVar34 + -1);
      pcVar16 = (code *)(long)(int)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 |
                                    (uVar22 & 0xff00) << 8 | uVar22 << 0x18);
      puVar25 = (undefined8 *)((long)auStack_107f + lVar8 + -4);
      pcVar36 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    case 0xd3:
      uVar28 = *(ulong *)((long)puVar34 + -1);
      pcVar16 = (code *)(uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                         (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                         (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                         (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
      puVar25 = auStack_107f + lVar7 * 2;
      pcVar36 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_10c0 = (code *)0x1311cd;
        test_read_num<double,int,int(*)(char_const**,double*)>();
        goto LAB_001311cd;
      }
      puVar25 = auStack_107f + lVar7 * 2 + -1;
    }
    if (pcVar16 != pcStack_10b8) goto LAB_0013121f;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_001311d7;
    uVar28 = *(ulong *)((long)puVar34 + -1);
    dVar17 = (double)(uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                      (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                      (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                      (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
    if ((dVar17 != dStack_10a8) || (NAN(dVar17) || NAN(dStack_10a8))) {
      pcStack_10c0 = (code *)0x1311fb;
      test_read_num<double,int,int(*)(char_const**,double*)>();
      goto LAB_001311fb;
    }
    puVar25 = auStack_107f + lVar7 * 2;
  }
  puStack_1098 = (undefined8 *)((long)puVar34 + -2);
  puVar9 = (undefined1 *)(ulong)(uint)(int)(char)bVar2;
  dStack_10a0 = 0.0;
  pcStack_10c0 = (code *)0x131113;
  iVar4 = (*(code *)pacStack_1090)(&puStack_1098,&dStack_10a0);
  pcStack_10c0 = (code *)0x13113b;
  _ok((uint)(iVar4 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",puVar9);
  pcStack_10c0 = (code *)0x131163;
  _ok((uint)(puVar25 == puStack_1098),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar42 = ABS(dStack_10a8 - dStack_10a0) < 1e-15;
  pcVar41 = (char *)(ulong)bVar42;
  pcVar36 = "double_eq(num1, num2)";
  pcStack_10c0 = (code *)0x1311a6;
  _ok((uint)bVar42,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar7 = lVar7 + 1;
  puVar34 = puVar34 + 2;
  uVar38 = uVar38 - 1;
  if (uVar38 == 0) {
    return;
  }
  goto LAB_00130f73;
LAB_00131368:
  lVar8 = lVar7 * 0x10;
  bVar2 = pcVar39[-2];
  pacVar10 = (char (*) [16])(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pacVar10];
  pcVar20 = pcVar39;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pacVar10 = (char (*) [16])(ulong)(byte)pcVar39[-1];
      break;
    case 0xcd:
      pacVar10 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar39 + -1) << 8 | *(ushort *)(pcVar39 + -1) >> 8);
      pcVar20 = acStack_12e7 + lVar8 + -6;
      break;
    case 0xce:
      uVar22 = *(uint *)(pcVar39 + -1);
      pacVar10 = (char (*) [16])
                 (ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                        uVar22 << 0x18);
      pcVar20 = acStack_12e7 + lVar8 + -4;
      break;
    case 0xcf:
      uVar28 = *(ulong *)(pcVar39 + -1);
      pacVar10 = (char (*) [16])
                 (uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                  (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                  (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                  (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
      pcVar20 = acStack_12e7 + lVar7 * 0x10;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_00131627:
        pcStack_1328 = (code *)0x13162c;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_0013162c:
        pcStack_1328 = (code *)0x131631;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00131631:
        pcStack_1328 = (code *)0x131650;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar20 = acStack_12e7 + (lVar7 * 2 + -1) * 8;
    }
    if (pacVar10 != pacStack_1320) {
      pcStack_1328 = (code *)0x131679;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00131679:
      pcStack_1328 = test_read_num<double,long_long,int(*)(char_const**,double*)>;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_1558,"typed read of ",0xf);
      pcStack_1590 = (code *)0x1316e2;
      uStack_1574 = extraout_EDX_00;
      pacStack_1560 = (char (*) [16])pcVar41;
      lStack_1350 = lVar7;
      uStack_1348 = uVar38;
      pcStack_1340 = pcVar36;
      pcStack_1338 = pcVar20;
      pcStack_1330 = pcVar39;
      pcStack_1328 = (code *)pcVar18;
      iVar4 = snprintf(acStack_1558 + 0xe,0xf2,"%lld",pacVar15);
      pcVar36 = acStack_1558 + (long)iVar4 + 0xe;
      pcStack_1590 = (code *)0x131703;
      iVar4 = snprintf(pcVar36,(size_t)(&bStack_1458 + -(long)pcVar36)," into ");
      pcStack_1590 = (code *)0x13171d;
      snprintf(pcVar36 + iVar4,(size_t)(&bStack_1458 + -(long)(pcVar36 + iVar4)),"double");
      pcStack_1590 = (code *)0x13172c;
      _space((FILE *)_stdout);
      pcStack_1590 = (code *)0x131745;
      fwrite("# ",2,1,_stdout);
      pcStack_1590 = (code *)0x131752;
      fputs(acStack_1558,_stdout);
      pcStack_1590 = (code *)0x13175f;
      fputc(10,_stdout);
      pacVar10 = (char (*) [16])&bStack_1458;
      pcStack_1590 = (code *)0x131773;
      pacStack_1588 = pacVar15;
      uVar22 = test_encode_int_all_sizes(pacVar10,(int64_t)pacVar15);
      if ((int)uVar22 < 1) {
        return;
      }
      fStack_1578 = (float)(long)pacStack_1588;
      dStack_1570 = (double)(long)pacStack_1588;
      uVar38 = (ulong)uVar22;
      pcVar41 = (char *)((long)&uStack_1457 + 1);
      lVar7 = 0;
      goto LAB_001317a5;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_00131655:
      pcStack_1328 = (code *)0x131674;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar22 = *(uint *)(pcVar39 + -1);
    fVar13 = (float)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                    uVar22 << 0x18);
    if ((fVar13 != fStack_1310) || (NAN(fVar13) || NAN(fStack_1310))) goto LAB_0013162c;
    pcVar20 = pcVar39 + 3;
  }
  else if (mVar3 == MP_INT) {
    pacVar10 = (char (*) [16])(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pacVar10 = (char (*) [16])(long)pcVar39[-1];
      pcVar41 = (char *)&switchD_001313bd::switchdataD_00139bac;
      break;
    case 0xd1:
      pacVar10 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar39 + -1) << 8 | *(ushort *)(pcVar39 + -1) >> 8);
      pcVar41 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar20 = acStack_12e7 + lVar8 + -6;
      break;
    case 0xd2:
      uVar22 = *(uint *)(pcVar39 + -1);
      pacVar10 = (char (*) [16])
                 (long)(int)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                            uVar22 << 0x18);
      pcVar41 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar20 = acStack_12e7 + lVar8 + -4;
      break;
    case 0xd3:
      uVar28 = *(ulong *)(pcVar39 + -1);
      pacVar10 = (char (*) [16])
                 (uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                  (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                  (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                  (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
      pcVar41 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar20 = acStack_12e7 + lVar7 * 0x10;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_1328 = (code *)0x131627;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
        goto LAB_00131627;
      }
      pcVar20 = acStack_12e7 + (lVar7 * 2 + -1) * 8;
    }
    if (pacVar10 != pacStack_1320) goto LAB_00131679;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_00131631;
    uVar28 = *(ulong *)(pcVar39 + -1);
    dVar17 = (double)(uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                      (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                      (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                      (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
    if ((dVar17 != dStack_1308) || (NAN(dVar17) || NAN(dStack_1308))) {
      pcStack_1328 = (code *)0x131655;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      goto LAB_00131655;
    }
    pcVar20 = acStack_12e7 + lVar7 * 0x10;
  }
  pcVar18 = pcVar39 + -2;
  pcVar36 = (char *)(ulong)(uint)(int)(char)bVar2;
  dStack_1300 = 0.0;
  pcStack_1328 = (code *)0x131508;
  pcStack_1318 = pcVar18;
  iVar4 = (*pcStack_12f8)(&pcStack_1318,&dStack_1300);
  if ((char)uStack_130c == '\0') {
    pcStack_1328 = (code *)0x1315d8;
    _ok((uint)(iVar4 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar36);
    bVar42 = pcVar18 == pcStack_1318;
    pcVar41 = "mp_num_pos2 == mp_nums[i]";
    iVar4 = 0x738;
    pcVar20 = "check position";
  }
  else {
    pcVar18 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_1328 = (code *)0x131542;
    _ok((uint)(iVar4 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar36);
    pcStack_1328 = (code *)0x13156a;
    _ok((uint)(pcVar20 == pcStack_1318),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar42 = ABS(dStack_1308 - dStack_1300) < 1e-15;
    pcVar41 = "double_eq(num1, num2)";
    iVar4 = 0x73e;
    pcVar20 = "check float number";
  }
  pacVar15 = (char (*) [16])(ulong)bVar42;
  pcStack_1328 = (code *)0x131600;
  _ok((uint)bVar42,pcVar41,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar4,
      pcVar20);
  lVar7 = lVar7 + 1;
  pcVar39 = pcVar39 + 0x10;
  uVar38 = uVar38 - 1;
  if (uVar38 == 0) {
    return;
  }
  goto LAB_00131368;
LAB_001317a5:
  lVar8 = lVar7 * 0x10;
  bVar2 = pcVar41[-2];
  pacVar15 = (char (*) [16])(ulong)bVar2;
  mVar3 = mp_type_hint[(long)pacVar15];
  pcVar39 = pcVar41;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      pacVar15 = (char (*) [16])(ulong)(byte)pcVar41[-1];
      break;
    case 0xcd:
      pacVar15 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar41 + -1) << 8 | *(ushort *)(pcVar41 + -1) >> 8);
      pcVar39 = acStack_144f + lVar8 + -6;
      break;
    case 0xce:
      uVar22 = *(uint *)(pcVar41 + -1);
      pacVar15 = (char (*) [16])
                 (ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                        uVar22 << 0x18);
      pcVar39 = acStack_144f + lVar8 + -4;
      break;
    case 0xcf:
      uVar28 = *(ulong *)(pcVar41 + -1);
      pacVar15 = (char (*) [16])
                 (uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                  (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                  (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                  (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
      pcVar39 = acStack_144f + lVar7 * 0x10;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_00131a67:
        pcStack_1590 = (code *)0x131a6c;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a6c:
        pcStack_1590 = (code *)0x131a71;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a71:
        pcStack_1590 = (code *)0x131a90;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar39 = acStack_144f + (lVar7 * 2 + -1) * 8;
    }
    if (pacVar15 != pacStack_1588) {
      pcStack_1590 = (code *)0x131ab9;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131ab9:
      pcStack_1590 = test_read_num<double,float,int(*)(char_const**,double*)>;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_17c0,"typed read of ",0xf);
      pcStack_17e8 = (code *)0x131b1e;
      pacStack_17c8 = pacVar10;
      lStack_15b8 = lVar7;
      uStack_15b0 = uVar38;
      pcStack_15a8 = pcVar36;
      pcStack_15a0 = pcVar39;
      pcStack_1598 = pcVar41;
      pcStack_1590 = (code *)pcVar18;
      iVar4 = snprintf(acStack_17c0 + 0xe,0xf2,"%f",0x41590b2200000000);
      pcVar36 = acStack_17c0 + (long)iVar4 + 0xe;
      pcStack_17e8 = (code *)0x131b3f;
      iVar4 = snprintf(pcVar36,(size_t)(&bStack_16c0 + -(long)pcVar36)," into ");
      pbVar37 = &bStack_16c0 + -(long)(pcVar36 + iVar4);
      pcStack_17e8 = (code *)0x131b59;
      snprintf(pcVar36 + iVar4,(size_t)pbVar37,"double");
      pcStack_17e8 = (code *)0x131b68;
      _space((FILE *)_stdout);
      lVar8 = 1;
      pcStack_17e8 = (code *)0x131b87;
      fwrite("# ",2,1,_stdout);
      pcStack_17e8 = (code *)0x131b94;
      fputs(acStack_17c0,_stdout);
      pcVar16 = (code *)0xa;
      pcStack_17e8 = (code *)0x131ba1;
      fputc(10,_stdout);
      puVar34 = (undefined8 *)(auStack_16bf + 1);
      bStack_16c0 = 0xca;
      _auStack_16bf = 0x1059c84a;
      uStack_16b7._7_1_ = 0xcb;
      uStack_16af = 0x220b5941;
      lVar7 = 0;
      goto LAB_00131bd0;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_00131a95:
      pcStack_1590 = (code *)0x131ab4;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar22 = *(uint *)(pcVar41 + -1);
    fVar13 = (float)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                    uVar22 << 0x18);
    if ((fVar13 != fStack_1578) || (NAN(fVar13) || NAN(fStack_1578))) goto LAB_00131a6c;
    pcVar39 = pcVar41 + 3;
  }
  else if (mVar3 == MP_INT) {
    pacVar15 = (char (*) [16])(long)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      pacVar15 = (char (*) [16])(long)pcVar41[-1];
      break;
    case 0xd1:
      pacVar15 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar41 + -1) << 8 | *(ushort *)(pcVar41 + -1) >> 8);
      pcVar39 = acStack_144f + lVar8 + -6;
      break;
    case 0xd2:
      uVar22 = *(uint *)(pcVar41 + -1);
      pacVar15 = (char (*) [16])
                 (long)(int)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                            uVar22 << 0x18);
      pcVar39 = acStack_144f + lVar8 + -4;
      break;
    case 0xd3:
      uVar28 = *(ulong *)(pcVar41 + -1);
      pacVar15 = (char (*) [16])
                 (uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                  (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                  (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                  (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
      pcVar39 = acStack_144f + lVar7 * 0x10;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_1590 = (code *)0x131a67;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
        goto LAB_00131a67;
      }
      pcVar39 = acStack_144f + (lVar7 * 2 + -1) * 8;
    }
    if (pacVar15 != pacStack_1588) goto LAB_00131ab9;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_00131a71;
    uVar28 = *(ulong *)(pcVar41 + -1);
    dVar17 = (double)(uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 |
                      (uVar28 & 0xff0000000000) >> 0x18 | (uVar28 & 0xff00000000) >> 8 |
                      (uVar28 & 0xff000000) << 8 | (uVar28 & 0xff0000) << 0x18 |
                      (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
    if ((dVar17 != dStack_1570) || (NAN(dVar17) || NAN(dStack_1570))) {
      pcStack_1590 = (code *)0x131a95;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      goto LAB_00131a95;
    }
    pcVar39 = acStack_144f + lVar7 * 0x10;
  }
  pcVar18 = pcVar41 + -2;
  pcVar36 = (char *)(ulong)(uint)(int)(char)bVar2;
  dStack_1568 = 0.0;
  pcStack_1590 = (code *)0x131948;
  pcStack_1580 = pcVar18;
  iVar4 = (*(code *)pacStack_1560)(&pcStack_1580,&dStack_1568);
  if ((char)uStack_1574 == '\0') {
    pcStack_1590 = (code *)0x131a18;
    _ok((uint)(iVar4 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar36);
    bVar42 = pcVar18 == pcStack_1580;
    pcVar39 = "mp_num_pos2 == mp_nums[i]";
    iVar4 = 0x738;
    pcVar20 = "check position";
  }
  else {
    pcVar18 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_1590 = (code *)0x131982;
    _ok((uint)(iVar4 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar36);
    pcStack_1590 = (code *)0x1319aa;
    _ok((uint)(pcVar39 == pcStack_1580),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar42 = ABS(dStack_1570 - dStack_1568) < 1e-15;
    pcVar39 = "double_eq(num1, num2)";
    iVar4 = 0x73e;
    pcVar20 = "check float number";
  }
  pacVar10 = (char (*) [16])(ulong)bVar42;
  pcStack_1590 = (code *)0x131a40;
  _ok((uint)bVar42,pcVar39,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar4,
      pcVar20);
  lVar7 = lVar7 + 1;
  pcVar41 = pcVar41 + 0x10;
  uVar38 = uVar38 - 1;
  if (uVar38 == 0) {
    return;
  }
  goto LAB_001317a5;
LAB_00131bd0:
  lVar12 = lVar7 * 0x10;
  bVar2 = *(byte *)((long)puVar34 + -2);
  uVar38 = (ulong)bVar2;
  mVar3 = mp_type_hint[uVar38];
  puVar25 = puVar34;
  if (mVar3 == MP_UINT) {
    switch(bVar2) {
    case 0xcc:
      uVar38 = (ulong)*(byte *)((long)puVar34 + -1);
      break;
    case 0xcd:
      uVar38 = (ulong)(ushort)(*(ushort *)((long)puVar34 + -1) << 8 |
                              *(ushort *)((long)puVar34 + -1) >> 8);
      puVar25 = (undefined8 *)(auStack_16bd + lVar12);
      break;
    case 0xce:
      uVar22 = *(uint *)((long)puVar34 + -1);
      uVar38 = (ulong)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                      uVar22 << 0x18);
      puVar25 = (undefined8 *)(auStack_16bd + lVar12 + 2);
      break;
    case 0xcf:
      uVar38 = *(ulong *)((long)puVar34 + -1);
      uVar38 = uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
               (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
               (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 | (uVar38 & 0xff00) << 0x28
               | uVar38 << 0x38;
      puVar25 = &uStack_16b7 + lVar7 * 2;
      break;
    default:
      if ((char)bVar2 < '\0') {
LAB_00131e46:
        pcStack_17e8 = (code *)0x131e4b;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e4b:
        pcStack_17e8 = (code *)0x131e50;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e50:
        pcStack_17e8 = (code *)0x131e6f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar25 = (undefined8 *)(auStack_16bf + lVar12);
    }
    if (uVar38 != 0x642c88) {
      pcStack_17e8 = (code *)0x131e98;
      test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e98:
      pcStack_17e8 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_19f8,"typed read of ",0xf);
      puStack_17f8 = puVar25;
      pbStack_17f0 = pbVar37;
      pcStack_17e8 = (code *)lVar8;
      iVar4 = snprintf(acStack_19f8 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar36 = acStack_19f8 + (long)iVar4 + 0xe;
      iVar4 = snprintf(pcVar36,(size_t)(&uStack_18f8 + -(long)pcVar36)," into ");
      snprintf(pcVar36 + iVar4,(size_t)(&uStack_18f8 + -(long)(pcVar36 + iVar4)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_19f8,_stdout);
      fputc(10,_stdout);
      uStack_18f8 = 0xcb;
      uStack_18f7 = 0xb81e85eb513816c0;
      puStack_1a00 = &uStack_18f8;
      dStack_1a08 = 0.0;
      iVar4 = (*pcVar16)(&puStack_1a00,&dStack_1a08);
      _ok((uint)(iVar4 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_18ef == puStack_1a00),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_1a08) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
  }
  else if (mVar3 == MP_FLOAT) {
    if (bVar2 != 0xca) {
LAB_00131e74:
      pcStack_17e8 = (code *)0x131e93;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar22 = *(uint *)((long)puVar34 + -1);
    fVar13 = (float)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                    uVar22 << 0x18);
    if ((fVar13 != 6.565e+06) || (NAN(fVar13))) goto LAB_00131e4b;
    puVar25 = (undefined8 *)((long)puVar34 + 3);
  }
  else if (mVar3 == MP_INT) {
    uVar38 = (ulong)(char)bVar2;
    switch(bVar2) {
    case 0xd0:
      uVar38 = (ulong)*(char *)((long)puVar34 + -1);
      break;
    case 0xd1:
      uVar38 = (ulong)(short)(*(ushort *)((long)puVar34 + -1) << 8 |
                             *(ushort *)((long)puVar34 + -1) >> 8);
      puVar25 = (undefined8 *)(auStack_16bd + lVar12);
      break;
    case 0xd2:
      uVar22 = *(uint *)((long)puVar34 + -1);
      uVar38 = (ulong)(int)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                           uVar22 << 0x18);
      puVar25 = (undefined8 *)(auStack_16bd + lVar12 + 2);
      break;
    case 0xd3:
      uVar38 = *(ulong *)((long)puVar34 + -1);
      uVar38 = uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
               (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
               (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 | (uVar38 & 0xff00) << 0x28
               | uVar38 << 0x38;
      puVar25 = &uStack_16b7 + lVar7 * 2;
      break;
    default:
      if (bVar2 < 0xe0) {
        pcStack_17e8 = (code *)0x131e46;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00131e46;
      }
      puVar25 = (undefined8 *)(auStack_16bf + lVar12);
    }
    if (uVar38 != 0x642c88) goto LAB_00131e98;
  }
  else {
    if (bVar2 != 0xcb) goto LAB_00131e50;
    uVar38 = *(ulong *)((long)puVar34 + -1);
    dVar17 = (double)(uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                      (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                      (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                      (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
    if ((dVar17 != 6565000.0) || (NAN(dVar17))) {
      pcStack_17e8 = (code *)0x131e74;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      goto LAB_00131e74;
    }
    puVar25 = &uStack_16b7 + lVar7 * 2;
  }
  puStack_17d0 = (undefined8 *)((long)puVar34 + -2);
  pbVar37 = (byte *)(ulong)(uint)(int)(char)bVar2;
  dStack_17d8 = 0.0;
  pcStack_17e8 = (code *)0x131d8a;
  iVar4 = (*(code *)pacStack_17c8)(&puStack_17d0,&dStack_17d8);
  pcStack_17e8 = (code *)0x131db2;
  _ok((uint)(iVar4 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",pbVar37);
  pcStack_17e8 = (code *)0x131dda;
  _ok((uint)(puVar25 == puStack_17d0),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar42 = ABS(6565000.0 - dStack_17d8) < 1e-15;
  pcVar16 = (code *)(ulong)bVar42;
  pcStack_17e8 = (code *)0x131e1f;
  _ok((uint)bVar42,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar7 = lVar7 + 1;
  puVar34 = puVar34 + 2;
  lVar8 = lVar8 + -1;
  if (lVar8 != 0) {
    return;
  }
  goto LAB_00131bd0;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}